

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  uint uVar1;
  Geometry *pGVar2;
  RTCRayQueryContext *pRVar3;
  RTCFilterFunctionN p_Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  size_t k;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  byte bVar34;
  int iVar35;
  byte bVar36;
  ulong uVar37;
  long lVar38;
  undefined1 (*pauVar39) [32];
  byte bVar40;
  ulong *puVar41;
  NodeRef root;
  ulong uVar42;
  byte bVar43;
  undefined4 uVar44;
  bool bVar45;
  ulong uVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [64];
  undefined1 auVar90 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar91 [64];
  float fVar92;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 in_ZMM10 [64];
  undefined1 auVar93 [64];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2b21;
  RayK<8> *local_2b20;
  ulong local_2b18;
  RayQueryContext *local_2b10;
  RayK<8> *local_2b08;
  undefined4 local_2afc;
  undefined1 (*local_2af8) [32];
  RTCFilterFunctionNArguments local_2af0;
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  BVH *local_2a78;
  Intersectors *local_2a70;
  ulong local_2a68;
  ulong local_2a60;
  long local_2a58;
  undefined8 local_2a50;
  undefined8 uStack_2a48;
  undefined1 local_2a40 [32];
  undefined1 local_2a20 [32];
  RTCHitN local_2a00 [32];
  undefined1 local_29e0 [32];
  undefined1 local_29c0 [32];
  undefined1 local_29a0 [32];
  undefined1 local_2980 [32];
  undefined1 local_2960 [32];
  undefined1 local_2940 [32];
  uint local_2920;
  uint uStack_291c;
  uint uStack_2918;
  uint uStack_2914;
  uint uStack_2910;
  uint uStack_290c;
  uint uStack_2908;
  uint uStack_2904;
  uint local_2900;
  uint uStack_28fc;
  uint uStack_28f8;
  uint uStack_28f4;
  uint uStack_28f0;
  uint uStack_28ec;
  uint uStack_28e8;
  uint uStack_28e4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_28e0;
  undefined1 local_2880 [32];
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [8];
  float fStack_2818;
  float fStack_2814;
  float fStack_2810;
  float fStack_280c;
  float fStack_2808;
  undefined1 local_2800 [8];
  float fStack_27f8;
  float fStack_27f4;
  float fStack_27f0;
  float fStack_27ec;
  float fStack_27e8;
  undefined1 local_27e0 [8];
  float fStack_27d8;
  float fStack_27d4;
  float fStack_27d0;
  float fStack_27cc;
  float fStack_27c8;
  int local_27c0;
  int iStack_27bc;
  int iStack_27b8;
  int iStack_27b4;
  int iStack_27b0;
  int iStack_27ac;
  int iStack_27a8;
  int iStack_27a4;
  uint local_27a0;
  uint uStack_279c;
  uint uStack_2798;
  uint uStack_2794;
  uint uStack_2790;
  uint uStack_278c;
  uint uStack_2788;
  uint uStack_2784;
  uint local_2780;
  uint uStack_277c;
  uint uStack_2778;
  uint uStack_2774;
  uint uStack_2770;
  uint uStack_276c;
  uint uStack_2768;
  uint uStack_2764;
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined4 local_26c0;
  undefined4 uStack_26bc;
  undefined4 uStack_26b8;
  undefined4 uStack_26b4;
  undefined4 uStack_26b0;
  undefined4 uStack_26ac;
  undefined4 uStack_26a8;
  undefined4 uStack_26a4;
  undefined4 local_26a0;
  undefined4 uStack_269c;
  undefined4 uStack_2698;
  undefined4 uStack_2694;
  undefined4 uStack_2690;
  undefined4 uStack_268c;
  undefined4 uStack_2688;
  undefined4 uStack_2684;
  undefined4 local_2680;
  undefined4 uStack_267c;
  undefined4 uStack_2678;
  undefined4 uStack_2674;
  undefined4 uStack_2670;
  undefined4 uStack_266c;
  undefined4 uStack_2668;
  undefined4 uStack_2664;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  
  local_2a78 = (BVH *)This->ptr;
  local_2608 = (local_2a78->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar47 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar76 = ZEXT816(0) << 0x40;
      uVar46 = vcmpps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar76),5);
      uVar37 = vpcmpeqd_avx512vl(auVar47,(undefined1  [32])valid_i->field_0);
      uVar46 = uVar46 & uVar37;
      bVar40 = (byte)uVar46;
      if (bVar40 != 0) {
        local_28e0._0_8_ = *(undefined8 *)ray;
        local_28e0._8_8_ = *(undefined8 *)(ray + 8);
        local_28e0._16_8_ = *(undefined8 *)(ray + 0x10);
        local_28e0._24_8_ = *(undefined8 *)(ray + 0x18);
        local_28e0._32_8_ = *(undefined8 *)(ray + 0x20);
        local_28e0._40_8_ = *(undefined8 *)(ray + 0x28);
        local_28e0._48_8_ = *(undefined8 *)(ray + 0x30);
        local_28e0._56_8_ = *(undefined8 *)(ray + 0x38);
        local_28e0._64_8_ = *(undefined8 *)(ray + 0x40);
        local_28e0._72_8_ = *(undefined8 *)(ray + 0x48);
        local_28e0._80_8_ = *(undefined8 *)(ray + 0x50);
        local_28e0._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2880 = *(undefined1 (*) [32])(ray + 0x80);
        local_2860 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2840 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        auVar102 = ZEXT3264(auVar47);
        vandps_avx512vl(local_2880,auVar47);
        auVar72._8_4_ = 0x219392ef;
        auVar72._0_8_ = 0x219392ef219392ef;
        auVar72._12_4_ = 0x219392ef;
        auVar72._16_4_ = 0x219392ef;
        auVar72._20_4_ = 0x219392ef;
        auVar72._24_4_ = 0x219392ef;
        auVar72._28_4_ = 0x219392ef;
        auVar89 = ZEXT3264(auVar72);
        uVar37 = vcmpps_avx512vl(auVar47,auVar72,1);
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar103 = ZEXT3264(auVar48);
        auVar49 = vdivps_avx512vl(auVar48,local_2880);
        vandps_avx512vl(local_2860,auVar47);
        uVar42 = vcmpps_avx512vl(auVar49,auVar72,1);
        auVar50 = vdivps_avx512vl(auVar48,local_2860);
        vandps_avx512vl(local_2840,auVar47);
        uVar12 = vcmpps_avx512vl(auVar50,auVar72,1);
        auVar47 = vdivps_avx512vl(auVar48,local_2840);
        bVar45 = (bool)((byte)uVar37 & 1);
        local_2820._0_4_ = (uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar49._0_4_;
        bVar45 = (bool)((byte)(uVar37 >> 1) & 1);
        local_2820._4_4_ = (uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar49._4_4_;
        bVar45 = (bool)((byte)(uVar37 >> 2) & 1);
        fStack_2818 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar49._8_4_);
        bVar45 = (bool)((byte)(uVar37 >> 3) & 1);
        fStack_2814 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar49._12_4_);
        bVar45 = (bool)((byte)(uVar37 >> 4) & 1);
        fStack_2810 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar49._16_4_);
        bVar45 = (bool)((byte)(uVar37 >> 5) & 1);
        fStack_280c = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar49._20_4_);
        bVar45 = (bool)((byte)(uVar37 >> 6) & 1);
        fStack_2808 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar49._24_4_);
        bVar45 = SUB81(uVar37 >> 7,0);
        register0x00000918 = (uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar49._28_4_;
        bVar45 = (bool)((byte)uVar42 & 1);
        local_2800._0_4_ = (uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar50._0_4_;
        bVar45 = (bool)((byte)(uVar42 >> 1) & 1);
        local_2800._4_4_ = (uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar50._4_4_;
        bVar45 = (bool)((byte)(uVar42 >> 2) & 1);
        fStack_27f8 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar50._8_4_);
        bVar45 = (bool)((byte)(uVar42 >> 3) & 1);
        fStack_27f4 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar50._12_4_);
        bVar45 = (bool)((byte)(uVar42 >> 4) & 1);
        fStack_27f0 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar50._16_4_);
        bVar45 = (bool)((byte)(uVar42 >> 5) & 1);
        fStack_27ec = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar50._20_4_);
        bVar45 = (bool)((byte)(uVar42 >> 6) & 1);
        fStack_27e8 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar50._24_4_);
        bVar45 = SUB81(uVar42 >> 7,0);
        register0x00000918 = (uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar50._28_4_;
        bVar45 = (bool)((byte)uVar12 & 1);
        local_27e0._0_4_ = (uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar47._0_4_;
        bVar45 = (bool)((byte)(uVar12 >> 1) & 1);
        local_27e0._4_4_ = (uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar47._4_4_;
        bVar45 = (bool)((byte)(uVar12 >> 2) & 1);
        fStack_27d8 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar47._8_4_);
        bVar45 = (bool)((byte)(uVar12 >> 3) & 1);
        fStack_27d4 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar47._12_4_);
        bVar45 = (bool)((byte)(uVar12 >> 4) & 1);
        fStack_27d0 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar47._16_4_);
        bVar45 = (bool)((byte)(uVar12 >> 5) & 1);
        fStack_27cc = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar47._20_4_);
        bVar45 = (bool)((byte)(uVar12 >> 6) & 1);
        fStack_27c8 = (float)((uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar47._24_4_);
        bVar45 = SUB81(uVar12 >> 7,0);
        register0x00000918 = (uint)bVar45 * 0x5d5e0b6b | (uint)!bVar45 * auVar47._28_4_;
        uVar37 = vcmpps_avx512vl(_local_2820,ZEXT1632(auVar76),1);
        auVar47 = vpbroadcastd_avx512vl(ZEXT416(0x10));
        local_27c0 = (uint)((byte)uVar37 & 1) * auVar47._0_4_;
        iStack_27bc = (uint)((byte)(uVar37 >> 1) & 1) * auVar47._4_4_;
        iStack_27b8 = (uint)((byte)(uVar37 >> 2) & 1) * auVar47._8_4_;
        iStack_27b4 = (uint)((byte)(uVar37 >> 3) & 1) * auVar47._12_4_;
        iStack_27b0 = (uint)((byte)(uVar37 >> 4) & 1) * auVar47._16_4_;
        iStack_27ac = (uint)((byte)(uVar37 >> 5) & 1) * auVar47._20_4_;
        iStack_27a8 = (uint)((byte)(uVar37 >> 6) & 1) * auVar47._24_4_;
        iStack_27a4 = (uint)(byte)(uVar37 >> 7) * auVar47._28_4_;
        auVar48 = ZEXT1632(auVar76);
        uVar37 = vcmpps_avx512vl(_local_2800,auVar48,5);
        auVar47 = vpbroadcastd_avx512vl(ZEXT416(0x20));
        bVar45 = (bool)((byte)uVar37 & 1);
        bVar5 = (bool)((byte)(uVar37 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar37 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar37 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar37 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar37 >> 6) & 1);
        bVar11 = SUB81(uVar37 >> 7,0);
        local_27a0 = (uint)bVar45 * auVar47._0_4_ | (uint)!bVar45 * 0x30;
        uStack_279c = (uint)bVar5 * auVar47._4_4_ | (uint)!bVar5 * 0x30;
        uStack_2798 = (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * 0x30;
        uStack_2794 = (uint)bVar7 * auVar47._12_4_ | (uint)!bVar7 * 0x30;
        uStack_2790 = (uint)bVar8 * auVar47._16_4_ | (uint)!bVar8 * 0x30;
        uStack_278c = (uint)bVar9 * auVar47._20_4_ | (uint)!bVar9 * 0x30;
        uStack_2788 = (uint)bVar10 * auVar47._24_4_ | (uint)!bVar10 * 0x30;
        uStack_2784 = (uint)bVar11 * auVar47._28_4_ | (uint)!bVar11 * 0x30;
        uVar37 = vcmpps_avx512vl(_local_27e0,auVar48,5);
        auVar47 = vpbroadcastd_avx512vl(ZEXT416(0x40));
        bVar45 = (bool)((byte)uVar37 & 1);
        bVar5 = (bool)((byte)(uVar37 >> 1) & 1);
        bVar6 = (bool)((byte)(uVar37 >> 2) & 1);
        bVar7 = (bool)((byte)(uVar37 >> 3) & 1);
        bVar8 = (bool)((byte)(uVar37 >> 4) & 1);
        bVar9 = (bool)((byte)(uVar37 >> 5) & 1);
        bVar10 = (bool)((byte)(uVar37 >> 6) & 1);
        bVar11 = SUB81(uVar37 >> 7,0);
        local_2780 = (uint)bVar45 * auVar47._0_4_ | (uint)!bVar45 * 0x50;
        uStack_277c = (uint)bVar5 * auVar47._4_4_ | (uint)!bVar5 * 0x50;
        uStack_2778 = (uint)bVar6 * auVar47._8_4_ | (uint)!bVar6 * 0x50;
        uStack_2774 = (uint)bVar7 * auVar47._12_4_ | (uint)!bVar7 * 0x50;
        uStack_2770 = (uint)bVar8 * auVar47._16_4_ | (uint)!bVar8 * 0x50;
        uStack_276c = (uint)bVar9 * auVar47._20_4_ | (uint)!bVar9 * 0x50;
        uStack_2768 = (uint)bVar10 * auVar47._24_4_ | (uint)!bVar10 * 0x50;
        uStack_2764 = (uint)bVar11 * auVar47._28_4_ | (uint)!bVar11 * 0x50;
        local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar104 = ZEXT3264(local_1e80);
        auVar47 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar48);
        local_2760._0_4_ =
             (uint)(bVar40 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar40 & 1) * local_1e80._0_4_;
        bVar45 = (bool)((byte)(uVar46 >> 1) & 1);
        local_2760._4_4_ = (uint)bVar45 * auVar47._4_4_ | (uint)!bVar45 * local_1e80._4_4_;
        bVar45 = (bool)((byte)(uVar46 >> 2) & 1);
        local_2760._8_4_ = (uint)bVar45 * auVar47._8_4_ | (uint)!bVar45 * local_1e80._8_4_;
        bVar45 = (bool)((byte)(uVar46 >> 3) & 1);
        local_2760._12_4_ = (uint)bVar45 * auVar47._12_4_ | (uint)!bVar45 * local_1e80._12_4_;
        bVar45 = (bool)((byte)(uVar46 >> 4) & 1);
        local_2760._16_4_ = (uint)bVar45 * auVar47._16_4_ | (uint)!bVar45 * local_1e80._16_4_;
        bVar45 = (bool)((byte)(uVar46 >> 5) & 1);
        local_2760._20_4_ = (uint)bVar45 * auVar47._20_4_ | (uint)!bVar45 * local_1e80._20_4_;
        bVar45 = (bool)((byte)(uVar46 >> 6) & 1);
        local_2760._24_4_ = (uint)bVar45 * auVar47._24_4_ | (uint)!bVar45 * local_1e80._24_4_;
        bVar45 = SUB81(uVar46 >> 7,0);
        local_2760._28_4_ = (uint)bVar45 * auVar47._28_4_ | (uint)!bVar45 * local_1e80._28_4_;
        local_2afc = (undefined4)uVar46;
        auVar47 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),auVar48);
        local_2740._0_4_ =
             (uint)(bVar40 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar40 & 1) * -0x800000;
        bVar45 = (bool)((byte)(uVar46 >> 1) & 1);
        local_2740._4_4_ = (uint)bVar45 * auVar47._4_4_ | (uint)!bVar45 * -0x800000;
        bVar45 = (bool)((byte)(uVar46 >> 2) & 1);
        local_2740._8_4_ = (uint)bVar45 * auVar47._8_4_ | (uint)!bVar45 * -0x800000;
        bVar45 = (bool)((byte)(uVar46 >> 3) & 1);
        local_2740._12_4_ = (uint)bVar45 * auVar47._12_4_ | (uint)!bVar45 * -0x800000;
        bVar45 = (bool)((byte)(uVar46 >> 4) & 1);
        local_2740._16_4_ = (uint)bVar45 * auVar47._16_4_ | (uint)!bVar45 * -0x800000;
        bVar45 = (bool)((byte)(uVar46 >> 5) & 1);
        local_2740._20_4_ = (uint)bVar45 * auVar47._20_4_ | (uint)!bVar45 * -0x800000;
        bVar45 = (bool)((byte)(uVar46 >> 6) & 1);
        local_2740._24_4_ = (uint)bVar45 * auVar47._24_4_ | (uint)!bVar45 * -0x800000;
        bVar45 = SUB81(uVar46 >> 7,0);
        local_2740._28_4_ = (uint)bVar45 * auVar47._28_4_ | (uint)!bVar45 * -0x800000;
        bVar40 = ~bVar40;
        if (context->user == (RTCRayQueryContext *)0x0) {
          local_2b18 = 5;
        }
        else {
          local_2b18 = (ulong)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2b08 = ray + 0x100;
        puVar41 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar39 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_2760;
        local_2af8 = (undefined1 (*) [32])&local_2920;
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
        auVar105 = ZEXT3264(auVar47);
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
        auVar106 = ZEXT3264(auVar47);
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
        auVar107 = ZEXT3264(auVar47);
        auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar101 = ZEXT3264(auVar47);
        local_2a70 = This;
        local_2b10 = context;
        local_2b20 = ray;
        uVar46 = local_2b18;
LAB_00706640:
        do {
          do {
            root.ptr = puVar41[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_007076bf;
            puVar41 = puVar41 + -1;
            auVar47 = pauVar39[-1];
            auVar84 = ZEXT3264(auVar47);
            pauVar39 = pauVar39 + -1;
            uVar37 = vcmpps_avx512vl(auVar47,local_2740,1);
          } while ((char)uVar37 == '\0');
          uVar44 = (undefined4)uVar37;
          if (uVar46 < (uint)POPCOUNT(uVar44)) {
LAB_0070667f:
            do {
              uVar37 = 8;
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_007076bf;
                uVar13 = vcmpps_avx512vl(auVar84._0_32_,local_2740,9);
                if ((char)uVar13 == '\0') goto LAB_00706640;
                local_2a68 = (ulong)((uint)root.ptr & 0xf) - 8;
                bVar34 = bVar40;
                if (local_2a68 == 0) goto LAB_0070757e;
                bVar34 = ~bVar40;
                lVar38 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                uVar37 = 0;
                goto LAB_0070685a;
              }
              lVar38 = 0;
              auVar47 = auVar104._0_32_;
              do {
                uVar42 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar38 * 8);
                if (uVar42 == 8) {
                  auVar84 = ZEXT3264(auVar47);
                  break;
                }
                uVar44 = *(undefined4 *)(root.ptr + 0x20 + lVar38 * 4);
                auVar77._4_4_ = uVar44;
                auVar77._0_4_ = uVar44;
                auVar77._8_4_ = uVar44;
                auVar77._12_4_ = uVar44;
                auVar77._16_4_ = uVar44;
                auVar77._20_4_ = uVar44;
                auVar77._24_4_ = uVar44;
                auVar77._28_4_ = uVar44;
                auVar28._8_8_ = local_28e0._8_8_;
                auVar28._0_8_ = local_28e0._0_8_;
                auVar28._16_8_ = local_28e0._16_8_;
                auVar28._24_8_ = local_28e0._24_8_;
                auVar29._8_8_ = local_28e0._40_8_;
                auVar29._0_8_ = local_28e0._32_8_;
                auVar29._16_8_ = local_28e0._48_8_;
                auVar29._24_8_ = local_28e0._56_8_;
                auVar30._8_8_ = local_28e0._72_8_;
                auVar30._0_8_ = local_28e0._64_8_;
                auVar30._16_8_ = local_28e0._80_8_;
                auVar30._24_8_ = local_28e0._88_8_;
                auVar48 = vsubps_avx(auVar77,auVar28);
                auVar84._0_4_ = (float)local_2820._0_4_ * auVar48._0_4_;
                auVar84._4_4_ = (float)local_2820._4_4_ * auVar48._4_4_;
                auVar84._8_4_ = fStack_2818 * auVar48._8_4_;
                auVar84._12_4_ = fStack_2814 * auVar48._12_4_;
                auVar84._16_4_ = fStack_2810 * auVar48._16_4_;
                auVar84._20_4_ = fStack_280c * auVar48._20_4_;
                auVar84._28_36_ = auVar89._28_36_;
                auVar84._24_4_ = fStack_2808 * auVar48._24_4_;
                auVar72 = auVar84._0_32_;
                auVar89 = ZEXT3264(auVar72);
                uVar44 = *(undefined4 *)(root.ptr + 0x40 + lVar38 * 4);
                auVar78._4_4_ = uVar44;
                auVar78._0_4_ = uVar44;
                auVar78._8_4_ = uVar44;
                auVar78._12_4_ = uVar44;
                auVar78._16_4_ = uVar44;
                auVar78._20_4_ = uVar44;
                auVar78._24_4_ = uVar44;
                auVar78._28_4_ = uVar44;
                auVar48 = vsubps_avx(auVar78,auVar29);
                auVar91._0_4_ = (float)local_2800._0_4_ * auVar48._0_4_;
                auVar91._4_4_ = (float)local_2800._4_4_ * auVar48._4_4_;
                auVar91._8_4_ = fStack_27f8 * auVar48._8_4_;
                auVar91._12_4_ = fStack_27f4 * auVar48._12_4_;
                auVar91._16_4_ = fStack_27f0 * auVar48._16_4_;
                auVar91._20_4_ = fStack_27ec * auVar48._20_4_;
                auVar91._28_36_ = in_ZMM8._28_36_;
                auVar91._24_4_ = fStack_27e8 * auVar48._24_4_;
                auVar71 = auVar91._0_32_;
                in_ZMM8 = ZEXT3264(auVar71);
                uVar44 = *(undefined4 *)(root.ptr + 0x60 + lVar38 * 4);
                auVar79._4_4_ = uVar44;
                auVar79._0_4_ = uVar44;
                auVar79._8_4_ = uVar44;
                auVar79._12_4_ = uVar44;
                auVar79._16_4_ = uVar44;
                auVar79._20_4_ = uVar44;
                auVar79._24_4_ = uVar44;
                auVar79._28_4_ = uVar44;
                auVar48 = vsubps_avx(auVar79,auVar30);
                auVar93._0_4_ = (float)local_27e0._0_4_ * auVar48._0_4_;
                auVar93._4_4_ = (float)local_27e0._4_4_ * auVar48._4_4_;
                auVar93._8_4_ = fStack_27d8 * auVar48._8_4_;
                auVar93._12_4_ = fStack_27d4 * auVar48._12_4_;
                auVar93._16_4_ = fStack_27d0 * auVar48._16_4_;
                auVar93._20_4_ = fStack_27cc * auVar48._20_4_;
                auVar93._28_36_ = in_ZMM10._28_36_;
                auVar93._24_4_ = fStack_27c8 * auVar48._24_4_;
                auVar75 = auVar93._0_32_;
                in_ZMM10 = ZEXT3264(auVar75);
                uVar44 = *(undefined4 *)(root.ptr + 0x30 + lVar38 * 4);
                auVar80._4_4_ = uVar44;
                auVar80._0_4_ = uVar44;
                auVar80._8_4_ = uVar44;
                auVar80._12_4_ = uVar44;
                auVar80._16_4_ = uVar44;
                auVar80._20_4_ = uVar44;
                auVar80._24_4_ = uVar44;
                auVar80._28_4_ = uVar44;
                auVar48 = vsubps_avx(auVar80,auVar28);
                auVar22._4_4_ = (float)local_2820._4_4_ * auVar48._4_4_;
                auVar22._0_4_ = (float)local_2820._0_4_ * auVar48._0_4_;
                auVar22._8_4_ = fStack_2818 * auVar48._8_4_;
                auVar22._12_4_ = fStack_2814 * auVar48._12_4_;
                auVar22._16_4_ = fStack_2810 * auVar48._16_4_;
                auVar22._20_4_ = fStack_280c * auVar48._20_4_;
                auVar22._24_4_ = fStack_2808 * auVar48._24_4_;
                auVar22._28_4_ = (int)((ulong)local_28e0._24_8_ >> 0x20);
                uVar44 = *(undefined4 *)(root.ptr + 0x50 + lVar38 * 4);
                auVar81._4_4_ = uVar44;
                auVar81._0_4_ = uVar44;
                auVar81._8_4_ = uVar44;
                auVar81._12_4_ = uVar44;
                auVar81._16_4_ = uVar44;
                auVar81._20_4_ = uVar44;
                auVar81._24_4_ = uVar44;
                auVar81._28_4_ = uVar44;
                auVar48 = vsubps_avx(auVar81,auVar29);
                auVar23._4_4_ = (float)local_2800._4_4_ * auVar48._4_4_;
                auVar23._0_4_ = (float)local_2800._0_4_ * auVar48._0_4_;
                auVar23._8_4_ = fStack_27f8 * auVar48._8_4_;
                auVar23._12_4_ = fStack_27f4 * auVar48._12_4_;
                auVar23._16_4_ = fStack_27f0 * auVar48._16_4_;
                auVar23._20_4_ = fStack_27ec * auVar48._20_4_;
                auVar23._24_4_ = fStack_27e8 * auVar48._24_4_;
                auVar23._28_4_ = (int)((ulong)local_28e0._56_8_ >> 0x20);
                uVar44 = *(undefined4 *)(root.ptr + 0x70 + lVar38 * 4);
                auVar82._4_4_ = uVar44;
                auVar82._0_4_ = uVar44;
                auVar82._8_4_ = uVar44;
                auVar82._12_4_ = uVar44;
                auVar82._16_4_ = uVar44;
                auVar82._20_4_ = uVar44;
                auVar82._24_4_ = uVar44;
                auVar82._28_4_ = uVar44;
                auVar48 = vsubps_avx(auVar82,auVar30);
                auVar24._4_4_ = (float)local_27e0._4_4_ * auVar48._4_4_;
                auVar24._0_4_ = (float)local_27e0._0_4_ * auVar48._0_4_;
                auVar24._8_4_ = fStack_27d8 * auVar48._8_4_;
                auVar24._12_4_ = fStack_27d4 * auVar48._12_4_;
                auVar24._16_4_ = fStack_27d0 * auVar48._16_4_;
                auVar24._20_4_ = fStack_27cc * auVar48._20_4_;
                auVar24._24_4_ = fStack_27c8 * auVar48._24_4_;
                auVar24._28_4_ = (int)((ulong)local_28e0._88_8_ >> 0x20);
                auVar48 = vminps_avx(auVar72,auVar22);
                auVar49 = vminps_avx(auVar71,auVar23);
                auVar48 = vmaxps_avx(auVar48,auVar49);
                auVar49 = vminps_avx(auVar75,auVar24);
                auVar48 = vmaxps_avx(auVar48,auVar49);
                auVar50 = vmulps_avx512vl(auVar48,auVar105._0_32_);
                auVar48 = vmaxps_avx(auVar72,auVar22);
                auVar49 = vmaxps_avx(auVar71,auVar23);
                auVar49 = vminps_avx(auVar48,auVar49);
                auVar48 = vmaxps_avx(auVar75,auVar24);
                auVar48 = vminps_avx(auVar49,auVar48);
                auVar49 = vmulps_avx512vl(auVar48,auVar106._0_32_);
                auVar48 = vmaxps_avx(auVar50,local_2760);
                auVar49 = vminps_avx(auVar49,local_2740);
                uVar12 = vcmpps_avx512vl(auVar48,auVar49,2);
                if ((byte)uVar12 == 0) {
                  auVar84 = ZEXT3264(auVar47);
                  uVar42 = uVar37;
                }
                else {
                  auVar48 = vblendmps_avx512vl(auVar104._0_32_,auVar50);
                  bVar45 = (bool)((byte)uVar12 & 1);
                  bVar5 = (bool)((byte)(uVar12 >> 1) & 1);
                  bVar6 = (bool)((byte)(uVar12 >> 2) & 1);
                  bVar7 = (bool)((byte)(uVar12 >> 3) & 1);
                  bVar8 = (bool)((byte)(uVar12 >> 4) & 1);
                  bVar9 = (bool)((byte)(uVar12 >> 5) & 1);
                  bVar10 = (bool)((byte)(uVar12 >> 6) & 1);
                  bVar11 = SUB81(uVar12 >> 7,0);
                  auVar84 = ZEXT3264(CONCAT428((uint)bVar11 * auVar48._28_4_ |
                                               (uint)!bVar11 * auVar50._28_4_,
                                               CONCAT424((uint)bVar10 * auVar48._24_4_ |
                                                         (uint)!bVar10 * auVar50._24_4_,
                                                         CONCAT420((uint)bVar9 * auVar48._20_4_ |
                                                                   (uint)!bVar9 * auVar50._20_4_,
                                                                   CONCAT416((uint)bVar8 *
                                                                             auVar48._16_4_ |
                                                                             (uint)!bVar8 *
                                                                             auVar50._16_4_,
                                                                             CONCAT412((uint)bVar7 *
                                                                                       auVar48.
                                                  _12_4_ | (uint)!bVar7 * auVar50._12_4_,
                                                  CONCAT48((uint)bVar6 * auVar48._8_4_ |
                                                           (uint)!bVar6 * auVar50._8_4_,
                                                           CONCAT44((uint)bVar5 * auVar48._4_4_ |
                                                                    (uint)!bVar5 * auVar50._4_4_,
                                                                    (uint)bVar45 * auVar48._0_4_ |
                                                                    (uint)!bVar45 * auVar50._0_4_)))
                                                  )))));
                  if (uVar37 != 8) {
                    *puVar41 = uVar37;
                    puVar41 = puVar41 + 1;
                    *pauVar39 = auVar47;
                    pauVar39 = pauVar39 + 1;
                  }
                }
                uVar37 = uVar42;
                lVar38 = lVar38 + 1;
                auVar47 = auVar84._0_32_;
              } while (lVar38 != 4);
              if (uVar37 == 8) goto LAB_00706801;
              uVar13 = vcmpps_avx512vl(auVar84._0_32_,local_2740,9);
              root.ptr = uVar37;
            } while ((byte)uVar46 < (byte)POPCOUNT((int)uVar13));
            *puVar41 = uVar37;
            puVar41 = puVar41 + 1;
            *pauVar39 = auVar84._0_32_;
            pauVar39 = pauVar39 + 1;
LAB_00706801:
            iVar35 = 4;
          }
          else {
            do {
              local_2ac0 = auVar47;
              k = 0;
              for (uVar46 = uVar37; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
                k = k + 1;
              }
              auVar89 = ZEXT1664(auVar89._0_16_);
              in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
              in_ZMM10 = ZEXT1664(in_ZMM10._0_16_);
              bVar45 = occluded1(local_2a70,local_2a78,root,k,&local_2b21,local_2b20,
                                 (TravRayK<8,_true> *)&local_28e0.field_0,context);
              bVar34 = (byte)(1 << ((uint)k & 0x1f));
              if (!bVar45) {
                bVar34 = 0;
              }
              bVar40 = bVar40 | bVar34;
              uVar37 = uVar37 - 1 & uVar37;
              context = local_2b10;
              auVar47 = local_2ac0;
            } while (uVar37 != 0);
            iVar35 = 3;
            if (bVar40 != 0xff) {
              auVar47 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
              local_2740._0_4_ =
                   (uint)(bVar40 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar40 & 1) * local_2740._0_4_
              ;
              bVar45 = (bool)(bVar40 >> 1 & 1);
              local_2740._4_4_ = (uint)bVar45 * auVar47._4_4_ | (uint)!bVar45 * local_2740._4_4_;
              bVar45 = (bool)(bVar40 >> 2 & 1);
              local_2740._8_4_ = (uint)bVar45 * auVar47._8_4_ | (uint)!bVar45 * local_2740._8_4_;
              bVar45 = (bool)(bVar40 >> 3 & 1);
              local_2740._12_4_ = (uint)bVar45 * auVar47._12_4_ | (uint)!bVar45 * local_2740._12_4_;
              bVar45 = (bool)(bVar40 >> 4 & 1);
              local_2740._16_4_ = (uint)bVar45 * auVar47._16_4_ | (uint)!bVar45 * local_2740._16_4_;
              bVar45 = (bool)(bVar40 >> 5 & 1);
              local_2740._20_4_ = (uint)bVar45 * auVar47._20_4_ | (uint)!bVar45 * local_2740._20_4_;
              bVar45 = (bool)(bVar40 >> 6 & 1);
              local_2740._24_4_ = (uint)bVar45 * auVar47._24_4_ | (uint)!bVar45 * local_2740._24_4_;
              local_2740._28_4_ =
                   (uint)(bVar40 >> 7) * auVar47._28_4_ |
                   (uint)!(bool)(bVar40 >> 7) * local_2740._28_4_;
              iVar35 = 2;
            }
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            auVar102 = ZEXT3264(auVar47);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
            auVar103 = ZEXT3264(auVar47);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
            auVar104 = ZEXT3264(auVar47);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
            auVar105 = ZEXT3264(auVar47);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
            auVar106 = ZEXT3264(auVar47);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
            auVar107 = ZEXT3264(auVar47);
            auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar101 = ZEXT3264(auVar47);
            auVar84 = ZEXT3264(local_2ac0);
            ray = local_2b20;
            uVar46 = local_2b18;
            if ((uint)local_2b18 < (uint)POPCOUNT(uVar44)) goto LAB_0070667f;
          }
        } while (iVar35 != 3);
LAB_007076bf:
        bVar40 = bVar40 & (byte)local_2afc;
        bVar45 = (bool)(bVar40 >> 1 & 1);
        bVar5 = (bool)(bVar40 >> 2 & 1);
        bVar6 = (bool)(bVar40 >> 3 & 1);
        bVar7 = (bool)(bVar40 >> 4 & 1);
        bVar8 = (bool)(bVar40 >> 5 & 1);
        bVar9 = (bool)(bVar40 >> 6 & 1);
        *(uint *)local_2b08 =
             (uint)(bVar40 & 1) * -0x800000 | (uint)!(bool)(bVar40 & 1) * *(int *)local_2b08;
        *(uint *)(local_2b08 + 4) =
             (uint)bVar45 * -0x800000 | (uint)!bVar45 * *(int *)(local_2b08 + 4);
        *(uint *)(local_2b08 + 8) =
             (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(local_2b08 + 8);
        *(uint *)(local_2b08 + 0xc) =
             (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(local_2b08 + 0xc);
        *(uint *)(local_2b08 + 0x10) =
             (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(local_2b08 + 0x10);
        *(uint *)(local_2b08 + 0x14) =
             (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(local_2b08 + 0x14);
        *(uint *)(local_2b08 + 0x18) =
             (uint)bVar9 * -0x800000 | (uint)!bVar9 * *(int *)(local_2b08 + 0x18);
        *(uint *)(local_2b08 + 0x1c) =
             (uint)(bVar40 >> 7) * -0x800000 |
             (uint)!(bool)(bVar40 >> 7) * *(int *)(local_2b08 + 0x1c);
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    uVar37 = local_2a60 + 1;
    lVar38 = lVar38 + 0xe0;
    if (local_2a68 <= uVar37) break;
LAB_0070685a:
    local_2a58 = uVar37 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    local_2ac0._0_8_ = lVar38;
    uVar42 = 0;
    local_2a60 = uVar37;
    bVar43 = bVar34;
    while (uVar37 = (ulong)*(uint *)(lVar38 + uVar42 * 4), uVar37 != 0xffffffff) {
      uVar44 = *(undefined4 *)(lVar38 + -0xc0 + uVar42 * 4);
      auVar75._4_4_ = uVar44;
      auVar75._0_4_ = uVar44;
      auVar75._8_4_ = uVar44;
      auVar75._12_4_ = uVar44;
      auVar75._16_4_ = uVar44;
      auVar75._20_4_ = uVar44;
      auVar75._24_4_ = uVar44;
      auVar75._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar38 + -0xb0 + uVar42 * 4);
      auVar83._4_4_ = uVar44;
      auVar83._0_4_ = uVar44;
      auVar83._8_4_ = uVar44;
      auVar83._12_4_ = uVar44;
      auVar83._16_4_ = uVar44;
      auVar83._20_4_ = uVar44;
      auVar83._24_4_ = uVar44;
      auVar83._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar38 + -0xa0 + uVar42 * 4);
      auVar85._4_4_ = uVar44;
      auVar85._0_4_ = uVar44;
      auVar85._8_4_ = uVar44;
      auVar85._12_4_ = uVar44;
      auVar85._16_4_ = uVar44;
      auVar85._20_4_ = uVar44;
      auVar85._24_4_ = uVar44;
      auVar85._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar38 + -0x90 + uVar42 * 4);
      local_2a40._4_4_ = uVar44;
      local_2a40._0_4_ = uVar44;
      local_2a40._8_4_ = uVar44;
      local_2a40._12_4_ = uVar44;
      local_2a40._16_4_ = uVar44;
      local_2a40._20_4_ = uVar44;
      local_2a40._24_4_ = uVar44;
      local_2a40._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar38 + -0x80 + uVar42 * 4);
      local_2640._4_4_ = uVar44;
      local_2640._0_4_ = uVar44;
      local_2640._8_4_ = uVar44;
      local_2640._12_4_ = uVar44;
      local_2640._16_4_ = uVar44;
      local_2640._20_4_ = uVar44;
      local_2640._24_4_ = uVar44;
      local_2640._28_4_ = uVar44;
      uVar44 = *(undefined4 *)(lVar38 + -0x70 + uVar42 * 4);
      local_2660._4_4_ = uVar44;
      local_2660._0_4_ = uVar44;
      local_2660._8_4_ = uVar44;
      local_2660._12_4_ = uVar44;
      local_2660._16_4_ = uVar44;
      local_2660._20_4_ = uVar44;
      local_2660._24_4_ = uVar44;
      local_2660._28_4_ = uVar44;
      local_2680 = *(undefined4 *)(lVar38 + -0x60 + uVar42 * 4);
      uStack_267c = local_2680;
      uStack_2678 = local_2680;
      uStack_2674 = local_2680;
      uStack_2670 = local_2680;
      uStack_266c = local_2680;
      uStack_2668 = local_2680;
      uStack_2664 = local_2680;
      local_26a0 = *(undefined4 *)(lVar38 + -0x50 + uVar42 * 4);
      uStack_269c = local_26a0;
      uStack_2698 = local_26a0;
      uStack_2694 = local_26a0;
      uStack_2690 = local_26a0;
      uStack_268c = local_26a0;
      uStack_2688 = local_26a0;
      uStack_2684 = local_26a0;
      local_26c0 = *(undefined4 *)(lVar38 + -0x40 + uVar42 * 4);
      uStack_26bc = local_26c0;
      uStack_26b8 = local_26c0;
      uStack_26b4 = local_26c0;
      uStack_26b0 = local_26c0;
      uStack_26ac = local_26c0;
      uStack_26a8 = local_26c0;
      uStack_26a4 = local_26c0;
      local_26e0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar38 + -0x30 + uVar42 * 4)));
      local_2700 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar38 + -0x20 + uVar42 * 4)));
      local_2720 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(lVar38 + -0x10 + uVar42 * 4)));
      local_2a50 = *(undefined8 *)(local_2a58 + 0xd0);
      uStack_2a48 = *(undefined8 *)(local_2a58 + 0xd8);
      auVar47 = *(undefined1 (*) [32])ray;
      auVar48 = *(undefined1 (*) [32])(ray + 0x20);
      auVar49 = *(undefined1 (*) [32])(ray + 0x40);
      auVar50 = *(undefined1 (*) [32])(ray + 0x80);
      auVar72 = *(undefined1 (*) [32])(ray + 0xa0);
      in_ZMM8 = ZEXT3264(auVar72);
      auVar71 = *(undefined1 (*) [32])(ray + 0xc0);
      in_ZMM10 = ZEXT3264(auVar71);
      auVar75 = vsubps_avx(auVar75,auVar47);
      auVar83 = vsubps_avx(auVar83,auVar48);
      auVar89 = ZEXT3264(auVar83);
      auVar85 = vsubps_avx(auVar85,auVar49);
      auVar64 = vsubps_avx(local_2a40,auVar47);
      auVar63 = vsubps_avx(local_2640,auVar48);
      auVar51 = vsubps_avx512vl(local_2660,auVar49);
      auVar52 = vsubps_avx512vl(local_26e0,auVar47);
      auVar53 = vsubps_avx512vl(local_2700,auVar48);
      auVar54 = vsubps_avx512vl(local_2720,auVar49);
      auVar55 = vsubps_avx512vl(auVar52,auVar75);
      auVar56 = vsubps_avx512vl(auVar53,auVar83);
      auVar57 = vsubps_avx512vl(auVar54,auVar85);
      auVar58 = vsubps_avx512vl(auVar75,auVar64);
      auVar59 = vsubps_avx512vl(auVar83,auVar63);
      auVar60 = vsubps_avx512vl(auVar85,auVar51);
      auVar61 = vaddps_avx512vl(auVar52,auVar75);
      auVar62 = vaddps_avx512vl(auVar53,auVar83);
      auVar49 = vaddps_avx512vl(auVar54,auVar85);
      auVar48._4_4_ = auVar57._4_4_ * auVar62._4_4_;
      auVar48._0_4_ = auVar57._0_4_ * auVar62._0_4_;
      auVar48._8_4_ = auVar57._8_4_ * auVar62._8_4_;
      auVar48._12_4_ = auVar57._12_4_ * auVar62._12_4_;
      auVar48._16_4_ = auVar57._16_4_ * auVar62._16_4_;
      auVar48._20_4_ = auVar57._20_4_ * auVar62._20_4_;
      auVar48._24_4_ = auVar57._24_4_ * auVar62._24_4_;
      auVar48._28_4_ = auVar47._28_4_;
      auVar19 = vfmsub231ps_fma(auVar48,auVar56,auVar49);
      auVar47._4_4_ = auVar55._4_4_ * auVar49._4_4_;
      auVar47._0_4_ = auVar55._0_4_ * auVar49._0_4_;
      auVar47._8_4_ = auVar55._8_4_ * auVar49._8_4_;
      auVar47._12_4_ = auVar55._12_4_ * auVar49._12_4_;
      auVar47._16_4_ = auVar55._16_4_ * auVar49._16_4_;
      auVar47._20_4_ = auVar55._20_4_ * auVar49._20_4_;
      auVar47._24_4_ = auVar55._24_4_ * auVar49._24_4_;
      auVar47._28_4_ = auVar49._28_4_;
      auVar76 = vfmsub231ps_fma(auVar47,auVar57,auVar61);
      auVar49._4_4_ = auVar56._4_4_ * auVar61._4_4_;
      auVar49._0_4_ = auVar56._0_4_ * auVar61._0_4_;
      auVar49._8_4_ = auVar56._8_4_ * auVar61._8_4_;
      auVar49._12_4_ = auVar56._12_4_ * auVar61._12_4_;
      auVar49._16_4_ = auVar56._16_4_ * auVar61._16_4_;
      auVar49._20_4_ = auVar56._20_4_ * auVar61._20_4_;
      auVar49._24_4_ = auVar56._24_4_ * auVar61._24_4_;
      auVar49._28_4_ = auVar61._28_4_;
      auVar20 = vfmsub231ps_fma(auVar49,auVar55,auVar62);
      fVar92 = auVar71._0_4_;
      auVar62._0_4_ = fVar92 * auVar20._0_4_;
      fVar94 = auVar71._4_4_;
      auVar62._4_4_ = fVar94 * auVar20._4_4_;
      fVar95 = auVar71._8_4_;
      auVar62._8_4_ = fVar95 * auVar20._8_4_;
      fVar96 = auVar71._12_4_;
      auVar62._12_4_ = fVar96 * auVar20._12_4_;
      fVar97 = auVar71._16_4_;
      auVar62._16_4_ = fVar97 * 0.0;
      fVar98 = auVar71._20_4_;
      auVar62._20_4_ = fVar98 * 0.0;
      fVar99 = auVar71._24_4_;
      auVar62._24_4_ = fVar99 * 0.0;
      auVar62._28_4_ = 0;
      auVar76 = vfmadd231ps_fma(auVar62,auVar72,ZEXT1632(auVar76));
      auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar50,ZEXT1632(auVar19));
      auVar65._0_4_ = auVar64._0_4_ + auVar75._0_4_;
      auVar65._4_4_ = auVar64._4_4_ + auVar75._4_4_;
      auVar65._8_4_ = auVar64._8_4_ + auVar75._8_4_;
      auVar65._12_4_ = auVar64._12_4_ + auVar75._12_4_;
      auVar65._16_4_ = auVar64._16_4_ + auVar75._16_4_;
      auVar65._20_4_ = auVar64._20_4_ + auVar75._20_4_;
      auVar65._24_4_ = auVar64._24_4_ + auVar75._24_4_;
      auVar65._28_4_ = auVar64._28_4_ + auVar75._28_4_;
      auVar66._0_4_ = auVar63._0_4_ + auVar83._0_4_;
      auVar66._4_4_ = auVar63._4_4_ + auVar83._4_4_;
      auVar66._8_4_ = auVar63._8_4_ + auVar83._8_4_;
      auVar66._12_4_ = auVar63._12_4_ + auVar83._12_4_;
      auVar66._16_4_ = auVar63._16_4_ + auVar83._16_4_;
      auVar66._20_4_ = auVar63._20_4_ + auVar83._20_4_;
      auVar66._24_4_ = auVar63._24_4_ + auVar83._24_4_;
      auVar66._28_4_ = auVar63._28_4_ + auVar83._28_4_;
      auVar47 = vaddps_avx512vl(auVar85,auVar51);
      auVar48 = vmulps_avx512vl(auVar66,auVar60);
      auVar48 = vfmsub231ps_avx512vl(auVar48,auVar59,auVar47);
      auVar47 = vmulps_avx512vl(auVar47,auVar58);
      auVar47 = vfmsub231ps_avx512vl(auVar47,auVar60,auVar65);
      auVar49 = vmulps_avx512vl(auVar65,auVar59);
      auVar49 = vfmsub231ps_avx512vl(auVar49,auVar58,auVar66);
      auVar62 = vsubps_avx512vl(auVar64,auVar52);
      auVar61._4_4_ = fVar94 * auVar49._4_4_;
      auVar61._0_4_ = fVar92 * auVar49._0_4_;
      auVar61._8_4_ = fVar95 * auVar49._8_4_;
      auVar61._12_4_ = fVar96 * auVar49._12_4_;
      auVar61._16_4_ = fVar97 * auVar49._16_4_;
      auVar61._20_4_ = fVar98 * auVar49._20_4_;
      auVar61._24_4_ = fVar99 * auVar49._24_4_;
      auVar61._28_4_ = auVar49._28_4_;
      auVar47 = vfmadd231ps_avx512vl(auVar61,auVar72,auVar47);
      auVar49 = vsubps_avx512vl(auVar63,auVar53);
      auVar19 = vfmadd231ps_fma(auVar47,auVar50,auVar48);
      auVar47 = vsubps_avx512vl(auVar51,auVar54);
      auVar48 = vaddps_avx512vl(auVar64,auVar52);
      auVar63 = vaddps_avx512vl(auVar63,auVar53);
      auVar64 = vaddps_avx512vl(auVar51,auVar54);
      auVar61 = vmulps_avx512vl(auVar63,auVar47);
      auVar61 = vfmsub231ps_avx512vl(auVar61,auVar49,auVar64);
      auVar64 = vmulps_avx512vl(auVar64,auVar62);
      auVar51 = vfmsub231ps_avx512vl(auVar64,auVar47,auVar48);
      auVar64._4_4_ = auVar48._4_4_ * auVar49._4_4_;
      auVar64._0_4_ = auVar48._0_4_ * auVar49._0_4_;
      auVar64._8_4_ = auVar48._8_4_ * auVar49._8_4_;
      auVar64._12_4_ = auVar48._12_4_ * auVar49._12_4_;
      auVar64._16_4_ = auVar48._16_4_ * auVar49._16_4_;
      auVar64._20_4_ = auVar48._20_4_ * auVar49._20_4_;
      auVar64._24_4_ = auVar48._24_4_ * auVar49._24_4_;
      auVar64._28_4_ = auVar48._28_4_;
      auVar20 = vfmsub231ps_fma(auVar64,auVar62,auVar63);
      auVar48 = vmulps_avx512vl(ZEXT1632(auVar20),auVar71);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar72,auVar51);
      auVar48 = vfmadd231ps_avx512vl(auVar48,auVar50,auVar61);
      auVar64 = vaddps_avx512vl(auVar48,ZEXT1632(CONCAT412(auVar76._12_4_ + auVar19._12_4_,
                                                           CONCAT48(auVar76._8_4_ + auVar19._8_4_,
                                                                    CONCAT44(auVar76._4_4_ +
                                                                             auVar19._4_4_,
                                                                             auVar76._0_4_ +
                                                                             auVar19._0_4_)))));
      auVar52 = auVar102._0_32_;
      vandps_avx512vl(auVar64,auVar52);
      auVar63 = vmulps_avx512vl(auVar64,auVar107._0_32_);
      auVar61 = vminps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar19));
      auVar61 = vminps_avx512vl(auVar61,auVar48);
      auVar51 = vxorps_avx512vl(auVar63,auVar101._0_32_);
      uVar13 = vcmpps_avx512vl(auVar61,auVar51,5);
      auVar61 = vmaxps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar19));
      auVar48 = vmaxps_avx512vl(auVar61,auVar48);
      uVar14 = vcmpps_avx512vl(auVar48,auVar63,2);
      bVar36 = ((byte)uVar13 | (byte)uVar14) & bVar43;
      if (bVar36 != 0) {
        auVar48 = vmulps_avx512vl(auVar59,auVar57);
        auVar63 = vmulps_avx512vl(auVar55,auVar60);
        auVar61 = vmulps_avx512vl(auVar58,auVar56);
        auVar51 = vmulps_avx512vl(auVar49,auVar60);
        auVar53 = vmulps_avx512vl(auVar58,auVar47);
        auVar54 = vmulps_avx512vl(auVar62,auVar59);
        auVar56 = vfmsub213ps_avx512vl(auVar56,auVar60,auVar48);
        auVar57 = vfmsub213ps_avx512vl(auVar57,auVar58,auVar63);
        auVar55 = vfmsub213ps_avx512vl(auVar55,auVar59,auVar61);
        auVar47 = vfmsub213ps_avx512vl(auVar47,auVar59,auVar51);
        auVar59 = vfmsub213ps_avx512vl(auVar62,auVar60,auVar53);
        auVar49 = vfmsub213ps_avx512vl(auVar49,auVar58,auVar54);
        vandps_avx512vl(auVar48,auVar52);
        vandps_avx512vl(auVar51,auVar52);
        uVar12 = vcmpps_avx512vl(auVar49,auVar49,1);
        vandps_avx512vl(auVar63,auVar52);
        vandps_avx512vl(auVar53,auVar52);
        uVar15 = vcmpps_avx512vl(auVar49,auVar49,1);
        vandps_avx512vl(auVar61,auVar52);
        vandps_avx512vl(auVar54,auVar52);
        uVar16 = vcmpps_avx512vl(auVar49,auVar49,1);
        bVar45 = (bool)((byte)uVar12 & 1);
        auVar51._0_4_ = (uint)bVar45 * auVar56._0_4_ | (uint)!bVar45 * auVar47._0_4_;
        bVar45 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar51._4_4_ = (uint)bVar45 * auVar56._4_4_ | (uint)!bVar45 * auVar47._4_4_;
        bVar45 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar51._8_4_ = (uint)bVar45 * auVar56._8_4_ | (uint)!bVar45 * auVar47._8_4_;
        bVar45 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar51._12_4_ = (uint)bVar45 * auVar56._12_4_ | (uint)!bVar45 * auVar47._12_4_;
        bVar45 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar51._16_4_ = (uint)bVar45 * auVar56._16_4_ | (uint)!bVar45 * auVar47._16_4_;
        bVar45 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar51._20_4_ = (uint)bVar45 * auVar56._20_4_ | (uint)!bVar45 * auVar47._20_4_;
        bVar45 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar51._24_4_ = (uint)bVar45 * auVar56._24_4_ | (uint)!bVar45 * auVar47._24_4_;
        bVar45 = SUB81(uVar12 >> 7,0);
        auVar51._28_4_ = (uint)bVar45 * auVar56._28_4_ | (uint)!bVar45 * auVar47._28_4_;
        bVar45 = (bool)((byte)uVar15 & 1);
        auVar52._0_4_ = (uint)bVar45 * auVar57._0_4_ | (uint)!bVar45 * auVar59._0_4_;
        bVar45 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar52._4_4_ = (uint)bVar45 * auVar57._4_4_ | (uint)!bVar45 * auVar59._4_4_;
        bVar45 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar52._8_4_ = (uint)bVar45 * auVar57._8_4_ | (uint)!bVar45 * auVar59._8_4_;
        bVar45 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar52._12_4_ = (uint)bVar45 * auVar57._12_4_ | (uint)!bVar45 * auVar59._12_4_;
        bVar45 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar52._16_4_ = (uint)bVar45 * auVar57._16_4_ | (uint)!bVar45 * auVar59._16_4_;
        bVar45 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar52._20_4_ = (uint)bVar45 * auVar57._20_4_ | (uint)!bVar45 * auVar59._20_4_;
        bVar45 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar52._24_4_ = (uint)bVar45 * auVar57._24_4_ | (uint)!bVar45 * auVar59._24_4_;
        bVar45 = SUB81(uVar15 >> 7,0);
        auVar52._28_4_ = (uint)bVar45 * auVar57._28_4_ | (uint)!bVar45 * auVar59._28_4_;
        bVar45 = (bool)((byte)uVar16 & 1);
        auVar53._0_4_ = (float)((uint)bVar45 * auVar55._0_4_ | (uint)!bVar45 * auVar49._0_4_);
        bVar45 = (bool)((byte)(uVar16 >> 1) & 1);
        auVar53._4_4_ = (float)((uint)bVar45 * auVar55._4_4_ | (uint)!bVar45 * auVar49._4_4_);
        bVar45 = (bool)((byte)(uVar16 >> 2) & 1);
        auVar53._8_4_ = (float)((uint)bVar45 * auVar55._8_4_ | (uint)!bVar45 * auVar49._8_4_);
        bVar45 = (bool)((byte)(uVar16 >> 3) & 1);
        auVar53._12_4_ = (float)((uint)bVar45 * auVar55._12_4_ | (uint)!bVar45 * auVar49._12_4_);
        bVar45 = (bool)((byte)(uVar16 >> 4) & 1);
        auVar53._16_4_ = (float)((uint)bVar45 * auVar55._16_4_ | (uint)!bVar45 * auVar49._16_4_);
        bVar45 = (bool)((byte)(uVar16 >> 5) & 1);
        auVar53._20_4_ = (float)((uint)bVar45 * auVar55._20_4_ | (uint)!bVar45 * auVar49._20_4_);
        bVar45 = (bool)((byte)(uVar16 >> 6) & 1);
        auVar53._24_4_ = (float)((uint)bVar45 * auVar55._24_4_ | (uint)!bVar45 * auVar49._24_4_);
        bVar45 = SUB81(uVar16 >> 7,0);
        auVar53._28_4_ = (uint)bVar45 * auVar55._28_4_ | (uint)!bVar45 * auVar49._28_4_;
        auVar63._4_4_ = fVar94 * auVar53._4_4_;
        auVar63._0_4_ = fVar92 * auVar53._0_4_;
        auVar63._8_4_ = fVar95 * auVar53._8_4_;
        auVar63._12_4_ = fVar96 * auVar53._12_4_;
        auVar63._16_4_ = fVar97 * auVar53._16_4_;
        auVar63._20_4_ = fVar98 * auVar53._20_4_;
        auVar63._24_4_ = fVar99 * auVar53._24_4_;
        auVar63._28_4_ = auVar71._28_4_;
        auVar20 = vfmadd213ps_fma(auVar72,auVar52,auVar63);
        auVar20 = vfmadd213ps_fma(auVar50,auVar51,ZEXT1632(auVar20));
        auVar50 = ZEXT1632(CONCAT412(auVar20._12_4_ + auVar20._12_4_,
                                     CONCAT48(auVar20._8_4_ + auVar20._8_4_,
                                              CONCAT44(auVar20._4_4_ + auVar20._4_4_,
                                                       auVar20._0_4_ + auVar20._0_4_))));
        auVar71._0_4_ = auVar85._0_4_ * auVar53._0_4_;
        auVar71._4_4_ = auVar85._4_4_ * auVar53._4_4_;
        auVar71._8_4_ = auVar85._8_4_ * auVar53._8_4_;
        auVar71._12_4_ = auVar85._12_4_ * auVar53._12_4_;
        auVar71._16_4_ = auVar85._16_4_ * auVar53._16_4_;
        auVar71._20_4_ = auVar85._20_4_ * auVar53._20_4_;
        auVar71._24_4_ = auVar85._24_4_ * auVar53._24_4_;
        auVar71._28_4_ = 0;
        auVar20 = vfmadd213ps_fma(auVar83,auVar52,auVar71);
        auVar18 = vfmadd213ps_fma(auVar75,auVar51,ZEXT1632(auVar20));
        auVar47 = vrcp14ps_avx512vl(auVar50);
        auVar89 = ZEXT3264(auVar47);
        auVar49 = vxorps_avx512vl(auVar50,auVar101._0_32_);
        in_ZMM8 = ZEXT3264(auVar49);
        auVar72 = auVar103._0_32_;
        auVar48 = vfnmadd213ps_avx512vl(auVar47,auVar50,auVar72);
        auVar20 = vfmadd132ps_fma(auVar48,auVar47,auVar47);
        auVar47 = *(undefined1 (*) [32])(ray + 0x100);
        in_ZMM10 = ZEXT3264(auVar47);
        auVar48 = ZEXT1632(CONCAT412(auVar20._12_4_ * (auVar18._12_4_ + auVar18._12_4_),
                                     CONCAT48(auVar20._8_4_ * (auVar18._8_4_ + auVar18._8_4_),
                                              CONCAT44(auVar20._4_4_ *
                                                       (auVar18._4_4_ + auVar18._4_4_),
                                                       auVar20._0_4_ *
                                                       (auVar18._0_4_ + auVar18._0_4_)))));
        uVar13 = vcmpps_avx512vl(auVar48,auVar47,2);
        uVar14 = vcmpps_avx512vl(auVar48,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar17 = vcmpps_avx512vl(auVar50,auVar49,4);
        bVar36 = bVar36 & (byte)uVar13 & (byte)uVar14 & (byte)uVar17;
        if (bVar36 != 0) {
          pGVar2 = (context->scene->geometries).items[uVar37].ptr;
          uVar1 = pGVar2->mask;
          auVar50._4_4_ = uVar1;
          auVar50._0_4_ = uVar1;
          auVar50._8_4_ = uVar1;
          auVar50._12_4_ = uVar1;
          auVar50._16_4_ = uVar1;
          auVar50._20_4_ = uVar1;
          auVar50._24_4_ = uVar1;
          auVar50._28_4_ = uVar1;
          auVar89 = ZEXT3264(auVar50);
          uVar13 = vptestmd_avx512vl(auVar50,*(undefined1 (*) [32])(ray + 0x120));
          bVar36 = bVar36 & (byte)uVar13;
          if (bVar36 != 0) {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              lVar38 = local_2ac0._0_8_;
            }
            else {
              auVar54._8_4_ = 0x219392ef;
              auVar54._0_8_ = 0x219392ef219392ef;
              auVar54._12_4_ = 0x219392ef;
              auVar54._16_4_ = 0x219392ef;
              auVar54._20_4_ = 0x219392ef;
              auVar54._24_4_ = 0x219392ef;
              auVar54._28_4_ = 0x219392ef;
              uVar37 = vcmpps_avx512vl(auVar64,auVar54,5);
              auVar50 = vrcp14ps_avx512vl(auVar64);
              auVar71 = vfnmadd213ps_avx512vl(auVar64,auVar50,auVar72);
              auVar50 = vfmadd132ps_avx512vl(auVar71,auVar50,auVar50);
              fVar94 = (float)((uint)((byte)uVar37 & 1) * auVar50._0_4_);
              fVar92 = (float)((uint)((byte)(uVar37 >> 1) & 1) * auVar50._4_4_);
              fVar95 = (float)((uint)((byte)(uVar37 >> 2) & 1) * auVar50._8_4_);
              fVar96 = (float)((uint)((byte)(uVar37 >> 3) & 1) * auVar50._12_4_);
              fVar97 = (float)((uint)((byte)(uVar37 >> 4) & 1) * auVar50._16_4_);
              fVar98 = (float)((uint)((byte)(uVar37 >> 5) & 1) * auVar50._20_4_);
              fVar99 = (float)((uint)((byte)(uVar37 >> 6) & 1) * auVar50._24_4_);
              auVar55._0_4_ = fVar94 * auVar76._0_4_;
              auVar55._4_4_ = fVar92 * auVar76._4_4_;
              auVar55._8_4_ = fVar95 * auVar76._8_4_;
              auVar55._12_4_ = fVar96 * auVar76._12_4_;
              auVar55._16_4_ = fVar97 * 0.0;
              auVar55._20_4_ = fVar98 * 0.0;
              auVar55._24_4_ = fVar99 * 0.0;
              auVar55._28_4_ = 0;
              local_29a0 = vminps_avx512vl(auVar55,auVar72);
              auVar56._0_4_ = fVar94 * auVar19._0_4_;
              auVar56._4_4_ = fVar92 * auVar19._4_4_;
              auVar56._8_4_ = fVar95 * auVar19._8_4_;
              auVar56._12_4_ = fVar96 * auVar19._12_4_;
              auVar56._16_4_ = fVar97 * 0.0;
              auVar56._20_4_ = fVar98 * 0.0;
              auVar56._24_4_ = fVar99 * 0.0;
              auVar56._28_4_ = 0;
              local_2980 = vminps_avx512vl(auVar56,auVar72);
              pRVar3 = context->user;
              local_2940 = vpbroadcastd_avx512vl();
              auVar89 = ZEXT3264(local_2940);
              local_2960 = vpbroadcastd_avx512vl();
              local_2a00[0] = (RTCHitN)(char)auVar51._0_4_;
              local_2a00[1] = (RTCHitN)(char)(auVar51._0_4_ >> 8);
              local_2a00[2] = (RTCHitN)(char)(auVar51._0_4_ >> 0x10);
              local_2a00[3] = (RTCHitN)(char)(auVar51._0_4_ >> 0x18);
              local_2a00[4] = (RTCHitN)(char)auVar51._4_4_;
              local_2a00[5] = (RTCHitN)(char)(auVar51._4_4_ >> 8);
              local_2a00[6] = (RTCHitN)(char)(auVar51._4_4_ >> 0x10);
              local_2a00[7] = (RTCHitN)(char)(auVar51._4_4_ >> 0x18);
              local_2a00[8] = (RTCHitN)(char)auVar51._8_4_;
              local_2a00[9] = (RTCHitN)(char)(auVar51._8_4_ >> 8);
              local_2a00[10] = (RTCHitN)(char)(auVar51._8_4_ >> 0x10);
              local_2a00[0xb] = (RTCHitN)(char)(auVar51._8_4_ >> 0x18);
              local_2a00[0xc] = (RTCHitN)(char)auVar51._12_4_;
              local_2a00[0xd] = (RTCHitN)(char)(auVar51._12_4_ >> 8);
              local_2a00[0xe] = (RTCHitN)(char)(auVar51._12_4_ >> 0x10);
              local_2a00[0xf] = (RTCHitN)(char)(auVar51._12_4_ >> 0x18);
              local_2a00[0x10] = (RTCHitN)(char)auVar51._16_4_;
              local_2a00[0x11] = (RTCHitN)(char)(auVar51._16_4_ >> 8);
              local_2a00[0x12] = (RTCHitN)(char)(auVar51._16_4_ >> 0x10);
              local_2a00[0x13] = (RTCHitN)(char)(auVar51._16_4_ >> 0x18);
              local_2a00[0x14] = (RTCHitN)(char)auVar51._20_4_;
              local_2a00[0x15] = (RTCHitN)(char)(auVar51._20_4_ >> 8);
              local_2a00[0x16] = (RTCHitN)(char)(auVar51._20_4_ >> 0x10);
              local_2a00[0x17] = (RTCHitN)(char)(auVar51._20_4_ >> 0x18);
              local_2a00[0x18] = (RTCHitN)(char)auVar51._24_4_;
              local_2a00[0x19] = (RTCHitN)(char)(auVar51._24_4_ >> 8);
              local_2a00[0x1a] = (RTCHitN)(char)(auVar51._24_4_ >> 0x10);
              local_2a00[0x1b] = (RTCHitN)(char)(auVar51._24_4_ >> 0x18);
              local_2a00[0x1c] = (RTCHitN)(char)auVar51._28_4_;
              local_2a00[0x1d] = (RTCHitN)(char)(auVar51._28_4_ >> 8);
              local_2a00[0x1e] = (RTCHitN)(char)(auVar51._28_4_ >> 0x10);
              local_2a00[0x1f] = (RTCHitN)(char)(auVar51._28_4_ >> 0x18);
              local_29e0 = auVar52;
              local_29c0 = auVar53;
              auVar50 = vpcmpeqd_avx2(local_29a0,local_29a0);
              local_2af8[1] = auVar50;
              *local_2af8 = auVar50;
              local_2920 = pRVar3->instID[0];
              uStack_291c = local_2920;
              uStack_2918 = local_2920;
              uStack_2914 = local_2920;
              uStack_2910 = local_2920;
              uStack_290c = local_2920;
              uStack_2908 = local_2920;
              uStack_2904 = local_2920;
              local_2900 = pRVar3->instPrimID[0];
              uStack_28fc = local_2900;
              uStack_28f8 = local_2900;
              uStack_28f4 = local_2900;
              uStack_28f0 = local_2900;
              uStack_28ec = local_2900;
              uStack_28e8 = local_2900;
              uStack_28e4 = local_2900;
              auVar48 = vblendmps_avx512vl(auVar47,auVar48);
              bVar45 = (bool)(bVar36 >> 1 & 1);
              bVar5 = (bool)(bVar36 >> 2 & 1);
              bVar6 = (bool)(bVar36 >> 3 & 1);
              bVar7 = (bool)(bVar36 >> 4 & 1);
              bVar8 = (bool)(bVar36 >> 5 & 1);
              bVar9 = (bool)(bVar36 >> 6 & 1);
              *(uint *)(ray + 0x100) =
                   (uint)(bVar36 & 1) * auVar48._0_4_ | !(bool)(bVar36 & 1) * local_2900;
              *(uint *)(ray + 0x104) = (uint)bVar45 * auVar48._4_4_ | !bVar45 * local_2900;
              *(uint *)(ray + 0x108) = (uint)bVar5 * auVar48._8_4_ | !bVar5 * local_2900;
              *(uint *)(ray + 0x10c) = (uint)bVar6 * auVar48._12_4_ | !bVar6 * local_2900;
              *(uint *)(ray + 0x110) = (uint)bVar7 * auVar48._16_4_ | !bVar7 * local_2900;
              *(uint *)(ray + 0x114) = (uint)bVar8 * auVar48._20_4_ | !bVar8 * local_2900;
              *(uint *)(ray + 0x118) = (uint)bVar9 * auVar48._24_4_ | !bVar9 * local_2900;
              *(uint *)(ray + 0x11c) =
                   (uint)(bVar36 >> 7) * auVar48._28_4_ | !(bool)(bVar36 >> 7) * local_2900;
              local_2aa0 = vpmovm2d_avx512vl((ulong)bVar36);
              local_2af0.valid = (int *)local_2aa0;
              local_2af0.geometryUserPtr = pGVar2->userPtr;
              local_2af0.context = context->user;
              local_2af0.hit = local_2a00;
              local_2af0.N = 8;
              local_2a20 = auVar47;
              local_2af0.ray = (RTCRayN *)ray;
              if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar89 = ZEXT1664(local_2940._0_16_);
                in_ZMM8 = ZEXT1664(auVar49._0_16_);
                (*pGVar2->occlusionFilterN)(&local_2af0);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar101 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar107 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar106 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar105 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar104 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar103 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar102 = ZEXT3264(auVar47);
                ray = local_2b20;
                uVar46 = local_2b18;
                context = local_2b10;
              }
              if (local_2aa0 == (undefined1  [32])0x0) {
                uVar37 = 0;
                lVar38 = local_2ac0._0_8_;
              }
              else {
                p_Var4 = context->args->filter;
                if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar89 = ZEXT1664(auVar89._0_16_);
                  in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                  (*p_Var4)(&local_2af0);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar101 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar107 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar106 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar105 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar104 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar103 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar102 = ZEXT3264(auVar47);
                  ray = local_2b20;
                  uVar46 = local_2b18;
                  context = local_2b10;
                }
                uVar37 = vptestmd_avx512vl(local_2aa0,local_2aa0);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar45 = (bool)((byte)uVar37 & 1);
                auVar57._0_4_ =
                     (uint)bVar45 * auVar47._0_4_ | (uint)!bVar45 * *(int *)(local_2af0.ray + 0x100)
                ;
                bVar45 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar57._4_4_ =
                     (uint)bVar45 * auVar47._4_4_ | (uint)!bVar45 * *(int *)(local_2af0.ray + 0x104)
                ;
                bVar45 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar57._8_4_ =
                     (uint)bVar45 * auVar47._8_4_ | (uint)!bVar45 * *(int *)(local_2af0.ray + 0x108)
                ;
                bVar45 = (bool)((byte)(uVar37 >> 3) & 1);
                auVar57._12_4_ =
                     (uint)bVar45 * auVar47._12_4_ |
                     (uint)!bVar45 * *(int *)(local_2af0.ray + 0x10c);
                bVar45 = (bool)((byte)(uVar37 >> 4) & 1);
                auVar57._16_4_ =
                     (uint)bVar45 * auVar47._16_4_ |
                     (uint)!bVar45 * *(int *)(local_2af0.ray + 0x110);
                bVar45 = (bool)((byte)(uVar37 >> 5) & 1);
                auVar57._20_4_ =
                     (uint)bVar45 * auVar47._20_4_ |
                     (uint)!bVar45 * *(int *)(local_2af0.ray + 0x114);
                bVar45 = (bool)((byte)(uVar37 >> 6) & 1);
                auVar57._24_4_ =
                     (uint)bVar45 * auVar47._24_4_ |
                     (uint)!bVar45 * *(int *)(local_2af0.ray + 0x118);
                bVar45 = SUB81(uVar37 >> 7,0);
                auVar57._28_4_ =
                     (uint)bVar45 * auVar47._28_4_ |
                     (uint)!bVar45 * *(int *)(local_2af0.ray + 0x11c);
                *(undefined1 (*) [32])(local_2af0.ray + 0x100) = auVar57;
                lVar38 = local_2ac0._0_8_;
              }
              bVar36 = (byte)uVar37;
              auVar58._0_4_ =
                   (uint)(bVar36 & 1) * *(int *)local_2b08 |
                   (uint)!(bool)(bVar36 & 1) * local_2a20._0_4_;
              bVar45 = (bool)((byte)(uVar37 >> 1) & 1);
              auVar58._4_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 4) | (uint)!bVar45 * local_2a20._4_4_;
              bVar45 = (bool)((byte)(uVar37 >> 2) & 1);
              auVar58._8_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 8) | (uint)!bVar45 * local_2a20._8_4_;
              bVar45 = (bool)((byte)(uVar37 >> 3) & 1);
              auVar58._12_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 0xc) | (uint)!bVar45 * local_2a20._12_4_;
              bVar45 = (bool)((byte)(uVar37 >> 4) & 1);
              auVar58._16_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 0x10) | (uint)!bVar45 * local_2a20._16_4_;
              bVar45 = (bool)((byte)(uVar37 >> 5) & 1);
              auVar58._20_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 0x14) | (uint)!bVar45 * local_2a20._20_4_;
              bVar45 = (bool)((byte)(uVar37 >> 6) & 1);
              auVar58._24_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 0x18) | (uint)!bVar45 * local_2a20._24_4_;
              bVar45 = (bool)((byte)(uVar37 >> 7) & 1);
              auVar58._28_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 0x1c) | (uint)!bVar45 * local_2a20._28_4_;
              in_ZMM10 = ZEXT3264(auVar58);
              *(undefined1 (*) [32])local_2b08 = auVar58;
            }
            bVar43 = bVar43 & ~bVar36;
          }
        }
      }
      if (bVar43 == 0) {
        bVar43 = 0;
        break;
      }
      auVar47 = *(undefined1 (*) [32])ray;
      auVar48 = *(undefined1 (*) [32])(ray + 0x20);
      auVar49 = *(undefined1 (*) [32])(ray + 0x40);
      auVar50 = *(undefined1 (*) [32])(ray + 0x80);
      auVar72 = *(undefined1 (*) [32])(ray + 0xa0);
      in_ZMM8 = ZEXT3264(auVar72);
      auVar71 = *(undefined1 (*) [32])(ray + 0xc0);
      in_ZMM10 = ZEXT3264(auVar71);
      auVar33._4_4_ = uStack_267c;
      auVar33._0_4_ = local_2680;
      auVar33._8_4_ = uStack_2678;
      auVar33._12_4_ = uStack_2674;
      auVar33._16_4_ = uStack_2670;
      auVar33._20_4_ = uStack_266c;
      auVar33._24_4_ = uStack_2668;
      auVar33._28_4_ = uStack_2664;
      auVar75 = vsubps_avx(auVar33,auVar47);
      auVar32._4_4_ = uStack_269c;
      auVar32._0_4_ = local_26a0;
      auVar32._8_4_ = uStack_2698;
      auVar32._12_4_ = uStack_2694;
      auVar32._16_4_ = uStack_2690;
      auVar32._20_4_ = uStack_268c;
      auVar32._24_4_ = uStack_2688;
      auVar32._28_4_ = uStack_2684;
      auVar83 = vsubps_avx(auVar32,auVar48);
      auVar89 = ZEXT3264(auVar83);
      auVar31._4_4_ = uStack_26bc;
      auVar31._0_4_ = local_26c0;
      auVar31._8_4_ = uStack_26b8;
      auVar31._12_4_ = uStack_26b4;
      auVar31._16_4_ = uStack_26b0;
      auVar31._20_4_ = uStack_26ac;
      auVar31._24_4_ = uStack_26a8;
      auVar31._28_4_ = uStack_26a4;
      auVar85 = vsubps_avx(auVar31,auVar49);
      auVar64 = vsubps_avx(local_26e0,auVar47);
      auVar63 = vsubps_avx(local_2700,auVar48);
      auVar61 = vsubps_avx512vl(local_2720,auVar49);
      auVar47 = vsubps_avx512vl(local_2a40,auVar47);
      auVar48 = vsubps_avx512vl(local_2640,auVar48);
      auVar49 = vsubps_avx512vl(local_2660,auVar49);
      auVar51 = vsubps_avx512vl(auVar47,auVar75);
      auVar52 = vsubps_avx512vl(auVar48,auVar83);
      auVar53 = vsubps_avx512vl(auVar49,auVar85);
      auVar54 = vsubps_avx512vl(auVar75,auVar64);
      auVar55 = vsubps_avx512vl(auVar83,auVar63);
      auVar56 = vsubps_avx512vl(auVar85,auVar61);
      auVar57 = vsubps_avx512vl(auVar64,auVar47);
      auVar58 = vsubps_avx512vl(auVar63,auVar48);
      auVar62 = vsubps_avx512vl(auVar61,auVar49);
      auVar60 = vaddps_avx512vl(auVar47,auVar75);
      auVar65 = vaddps_avx512vl(auVar48,auVar83);
      auVar59 = vaddps_avx512vl(auVar49,auVar85);
      auVar66 = vmulps_avx512vl(auVar65,auVar53);
      auVar66 = vfmsub231ps_avx512vl(auVar66,auVar52,auVar59);
      auVar59 = vmulps_avx512vl(auVar59,auVar51);
      auVar67 = vfmsub231ps_avx512vl(auVar59,auVar53,auVar60);
      auVar59._4_4_ = auVar52._4_4_ * auVar60._4_4_;
      auVar59._0_4_ = auVar52._0_4_ * auVar60._0_4_;
      auVar59._8_4_ = auVar52._8_4_ * auVar60._8_4_;
      auVar59._12_4_ = auVar52._12_4_ * auVar60._12_4_;
      auVar59._16_4_ = auVar52._16_4_ * auVar60._16_4_;
      auVar59._20_4_ = auVar52._20_4_ * auVar60._20_4_;
      auVar59._24_4_ = auVar52._24_4_ * auVar60._24_4_;
      auVar59._28_4_ = auVar60._28_4_;
      auVar76 = vfmsub231ps_fma(auVar59,auVar51,auVar65);
      fVar92 = auVar71._0_4_;
      auVar86._0_4_ = fVar92 * auVar76._0_4_;
      fVar94 = auVar71._4_4_;
      auVar86._4_4_ = fVar94 * auVar76._4_4_;
      fVar95 = auVar71._8_4_;
      auVar86._8_4_ = fVar95 * auVar76._8_4_;
      fVar96 = auVar71._12_4_;
      auVar86._12_4_ = fVar96 * auVar76._12_4_;
      fVar97 = auVar71._16_4_;
      auVar86._16_4_ = fVar97 * 0.0;
      fVar98 = auVar71._20_4_;
      auVar86._20_4_ = fVar98 * 0.0;
      fVar99 = auVar71._24_4_;
      auVar86._24_4_ = fVar99 * 0.0;
      auVar86._28_4_ = 0;
      auVar59 = vfmadd231ps_avx512vl(auVar86,auVar72,auVar67);
      auVar59 = vfmadd231ps_avx512vl(auVar59,auVar50,auVar66);
      auVar87._0_4_ = auVar64._0_4_ + auVar75._0_4_;
      auVar87._4_4_ = auVar64._4_4_ + auVar75._4_4_;
      auVar87._8_4_ = auVar64._8_4_ + auVar75._8_4_;
      auVar87._12_4_ = auVar64._12_4_ + auVar75._12_4_;
      auVar87._16_4_ = auVar64._16_4_ + auVar75._16_4_;
      auVar87._20_4_ = auVar64._20_4_ + auVar75._20_4_;
      auVar87._24_4_ = auVar64._24_4_ + auVar75._24_4_;
      auVar87._28_4_ = auVar64._28_4_ + auVar75._28_4_;
      auVar60 = vaddps_avx512vl(auVar83,auVar63);
      auVar65 = vaddps_avx512vl(auVar85,auVar61);
      auVar66 = vmulps_avx512vl(auVar60,auVar56);
      auVar66 = vfmsub231ps_avx512vl(auVar66,auVar55,auVar65);
      auVar65 = vmulps_avx512vl(auVar65,auVar54);
      auVar65 = vfmsub231ps_avx512vl(auVar65,auVar56,auVar87);
      auVar67 = vmulps_avx512vl(auVar87,auVar55);
      auVar67 = vfmsub231ps_avx512vl(auVar67,auVar54,auVar60);
      auVar60._4_4_ = fVar94 * auVar67._4_4_;
      auVar60._0_4_ = fVar92 * auVar67._0_4_;
      auVar60._8_4_ = fVar95 * auVar67._8_4_;
      auVar60._12_4_ = fVar96 * auVar67._12_4_;
      auVar60._16_4_ = fVar97 * auVar67._16_4_;
      auVar60._20_4_ = fVar98 * auVar67._20_4_;
      auVar60._24_4_ = fVar99 * auVar67._24_4_;
      auVar60._28_4_ = auVar67._28_4_;
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar72,auVar65);
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar50,auVar66);
      auVar65 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar101 = ZEXT3264(auVar65);
      auVar47 = vaddps_avx512vl(auVar64,auVar47);
      auVar48 = vaddps_avx512vl(auVar63,auVar48);
      auVar49 = vaddps_avx512vl(auVar61,auVar49);
      auVar64 = vmulps_avx512vl(auVar48,auVar62);
      auVar64 = vfmsub231ps_avx512vl(auVar64,auVar58,auVar49);
      auVar49 = vmulps_avx512vl(auVar49,auVar57);
      auVar49 = vfmsub231ps_avx512vl(auVar49,auVar62,auVar47);
      auVar67._4_4_ = auVar47._4_4_ * auVar58._4_4_;
      auVar67._0_4_ = auVar47._0_4_ * auVar58._0_4_;
      auVar67._8_4_ = auVar47._8_4_ * auVar58._8_4_;
      auVar67._12_4_ = auVar47._12_4_ * auVar58._12_4_;
      auVar67._16_4_ = auVar47._16_4_ * auVar58._16_4_;
      auVar67._20_4_ = auVar47._20_4_ * auVar58._20_4_;
      auVar67._24_4_ = auVar47._24_4_ * auVar58._24_4_;
      auVar67._28_4_ = auVar47._28_4_;
      auVar76 = vfmsub231ps_fma(auVar67,auVar57,auVar48);
      auVar47 = vmulps_avx512vl(ZEXT1632(auVar76),auVar71);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar72,auVar49);
      auVar47 = vfmadd231ps_avx512vl(auVar47,auVar50,auVar64);
      auVar100._0_4_ = auVar59._0_4_ + auVar60._0_4_;
      auVar100._4_4_ = auVar59._4_4_ + auVar60._4_4_;
      auVar100._8_4_ = auVar59._8_4_ + auVar60._8_4_;
      auVar100._12_4_ = auVar59._12_4_ + auVar60._12_4_;
      auVar100._16_4_ = auVar59._16_4_ + auVar60._16_4_;
      auVar100._20_4_ = auVar59._20_4_ + auVar60._20_4_;
      auVar100._24_4_ = auVar59._24_4_ + auVar60._24_4_;
      auVar100._28_4_ = auVar59._28_4_ + auVar60._28_4_;
      auVar48 = vaddps_avx512vl(auVar47,auVar100);
      auVar61 = auVar102._0_32_;
      vandps_avx512vl(auVar48,auVar61);
      auVar49 = vmulps_avx512vl(auVar48,auVar107._0_32_);
      auVar64 = vminps_avx512vl(auVar59,auVar60);
      auVar64 = vminps_avx512vl(auVar64,auVar47);
      auVar63 = vxorps_avx512vl(auVar49,auVar65);
      uVar13 = vcmpps_avx512vl(auVar64,auVar63,5);
      auVar64 = vmaxps_avx512vl(auVar59,auVar60);
      auVar47 = vmaxps_avx512vl(auVar64,auVar47);
      uVar14 = vcmpps_avx512vl(auVar47,auVar49,2);
      bVar36 = ((byte)uVar13 | (byte)uVar14) & bVar43;
      if (bVar36 != 0) {
        auVar47 = vmulps_avx512vl(auVar55,auVar53);
        auVar49 = vmulps_avx512vl(auVar51,auVar56);
        auVar64 = vmulps_avx512vl(auVar54,auVar52);
        auVar63 = vmulps_avx512vl(auVar58,auVar56);
        auVar66 = vmulps_avx512vl(auVar54,auVar62);
        auVar67 = vmulps_avx512vl(auVar57,auVar55);
        auVar52 = vfmsub213ps_avx512vl(auVar52,auVar56,auVar47);
        auVar53 = vfmsub213ps_avx512vl(auVar53,auVar54,auVar49);
        auVar51 = vfmsub213ps_avx512vl(auVar51,auVar55,auVar64);
        auVar55 = vfmsub213ps_avx512vl(auVar62,auVar55,auVar63);
        auVar56 = vfmsub213ps_avx512vl(auVar57,auVar56,auVar66);
        auVar54 = vfmsub213ps_avx512vl(auVar58,auVar54,auVar67);
        vandps_avx512vl(auVar47,auVar61);
        vandps_avx512vl(auVar63,auVar61);
        uVar37 = vcmpps_avx512vl(auVar54,auVar54,1);
        vandps_avx512vl(auVar49,auVar61);
        vandps_avx512vl(auVar66,auVar61);
        uVar12 = vcmpps_avx512vl(auVar54,auVar54,1);
        vandps_avx512vl(auVar64,auVar61);
        vandps_avx512vl(auVar67,auVar61);
        uVar15 = vcmpps_avx512vl(auVar54,auVar54,1);
        bVar45 = (bool)((byte)uVar37 & 1);
        auVar68._0_4_ = (uint)bVar45 * auVar52._0_4_ | (uint)!bVar45 * auVar55._0_4_;
        bVar45 = (bool)((byte)(uVar37 >> 1) & 1);
        auVar68._4_4_ = (uint)bVar45 * auVar52._4_4_ | (uint)!bVar45 * auVar55._4_4_;
        bVar45 = (bool)((byte)(uVar37 >> 2) & 1);
        auVar68._8_4_ = (uint)bVar45 * auVar52._8_4_ | (uint)!bVar45 * auVar55._8_4_;
        bVar45 = (bool)((byte)(uVar37 >> 3) & 1);
        auVar68._12_4_ = (uint)bVar45 * auVar52._12_4_ | (uint)!bVar45 * auVar55._12_4_;
        bVar45 = (bool)((byte)(uVar37 >> 4) & 1);
        auVar68._16_4_ = (uint)bVar45 * auVar52._16_4_ | (uint)!bVar45 * auVar55._16_4_;
        bVar45 = (bool)((byte)(uVar37 >> 5) & 1);
        auVar68._20_4_ = (uint)bVar45 * auVar52._20_4_ | (uint)!bVar45 * auVar55._20_4_;
        bVar45 = (bool)((byte)(uVar37 >> 6) & 1);
        auVar68._24_4_ = (uint)bVar45 * auVar52._24_4_ | (uint)!bVar45 * auVar55._24_4_;
        bVar45 = SUB81(uVar37 >> 7,0);
        auVar68._28_4_ = (uint)bVar45 * auVar52._28_4_ | (uint)!bVar45 * auVar55._28_4_;
        bVar45 = (bool)((byte)uVar12 & 1);
        auVar69._0_4_ = (uint)bVar45 * auVar53._0_4_ | (uint)!bVar45 * auVar56._0_4_;
        bVar45 = (bool)((byte)(uVar12 >> 1) & 1);
        auVar69._4_4_ = (uint)bVar45 * auVar53._4_4_ | (uint)!bVar45 * auVar56._4_4_;
        bVar45 = (bool)((byte)(uVar12 >> 2) & 1);
        auVar69._8_4_ = (uint)bVar45 * auVar53._8_4_ | (uint)!bVar45 * auVar56._8_4_;
        bVar45 = (bool)((byte)(uVar12 >> 3) & 1);
        auVar69._12_4_ = (uint)bVar45 * auVar53._12_4_ | (uint)!bVar45 * auVar56._12_4_;
        bVar45 = (bool)((byte)(uVar12 >> 4) & 1);
        auVar69._16_4_ = (uint)bVar45 * auVar53._16_4_ | (uint)!bVar45 * auVar56._16_4_;
        bVar45 = (bool)((byte)(uVar12 >> 5) & 1);
        auVar69._20_4_ = (uint)bVar45 * auVar53._20_4_ | (uint)!bVar45 * auVar56._20_4_;
        bVar45 = (bool)((byte)(uVar12 >> 6) & 1);
        auVar69._24_4_ = (uint)bVar45 * auVar53._24_4_ | (uint)!bVar45 * auVar56._24_4_;
        bVar45 = SUB81(uVar12 >> 7,0);
        auVar69._28_4_ = (uint)bVar45 * auVar53._28_4_ | (uint)!bVar45 * auVar56._28_4_;
        bVar45 = (bool)((byte)uVar15 & 1);
        auVar70._0_4_ = (float)((uint)bVar45 * auVar51._0_4_ | (uint)!bVar45 * auVar54._0_4_);
        bVar45 = (bool)((byte)(uVar15 >> 1) & 1);
        auVar70._4_4_ = (float)((uint)bVar45 * auVar51._4_4_ | (uint)!bVar45 * auVar54._4_4_);
        bVar45 = (bool)((byte)(uVar15 >> 2) & 1);
        auVar70._8_4_ = (float)((uint)bVar45 * auVar51._8_4_ | (uint)!bVar45 * auVar54._8_4_);
        bVar45 = (bool)((byte)(uVar15 >> 3) & 1);
        auVar70._12_4_ = (float)((uint)bVar45 * auVar51._12_4_ | (uint)!bVar45 * auVar54._12_4_);
        bVar45 = (bool)((byte)(uVar15 >> 4) & 1);
        auVar70._16_4_ = (float)((uint)bVar45 * auVar51._16_4_ | (uint)!bVar45 * auVar54._16_4_);
        bVar45 = (bool)((byte)(uVar15 >> 5) & 1);
        auVar70._20_4_ = (float)((uint)bVar45 * auVar51._20_4_ | (uint)!bVar45 * auVar54._20_4_);
        bVar45 = (bool)((byte)(uVar15 >> 6) & 1);
        auVar70._24_4_ = (float)((uint)bVar45 * auVar51._24_4_ | (uint)!bVar45 * auVar54._24_4_);
        bVar45 = SUB81(uVar15 >> 7,0);
        auVar70._28_4_ = (uint)bVar45 * auVar51._28_4_ | (uint)!bVar45 * auVar54._28_4_;
        auVar25._4_4_ = fVar94 * auVar70._4_4_;
        auVar25._0_4_ = fVar92 * auVar70._0_4_;
        auVar25._8_4_ = fVar95 * auVar70._8_4_;
        auVar25._12_4_ = fVar96 * auVar70._12_4_;
        auVar25._16_4_ = fVar97 * auVar70._16_4_;
        auVar25._20_4_ = fVar98 * auVar70._20_4_;
        auVar25._24_4_ = fVar99 * auVar70._24_4_;
        auVar25._28_4_ = auVar71._28_4_;
        auVar76 = vfmadd213ps_fma(auVar72,auVar69,auVar25);
        auVar76 = vfmadd213ps_fma(auVar50,auVar68,ZEXT1632(auVar76));
        auVar72 = ZEXT1632(CONCAT412(auVar76._12_4_ + auVar76._12_4_,
                                     CONCAT48(auVar76._8_4_ + auVar76._8_4_,
                                              CONCAT44(auVar76._4_4_ + auVar76._4_4_,
                                                       auVar76._0_4_ + auVar76._0_4_))));
        auVar90._0_4_ = auVar85._0_4_ * auVar70._0_4_;
        auVar90._4_4_ = auVar85._4_4_ * auVar70._4_4_;
        auVar90._8_4_ = auVar85._8_4_ * auVar70._8_4_;
        auVar90._12_4_ = auVar85._12_4_ * auVar70._12_4_;
        auVar90._16_4_ = auVar85._16_4_ * auVar70._16_4_;
        auVar90._20_4_ = auVar85._20_4_ * auVar70._20_4_;
        auVar90._24_4_ = auVar85._24_4_ * auVar70._24_4_;
        auVar90._28_4_ = 0;
        auVar76 = vfmadd213ps_fma(auVar83,auVar69,auVar90);
        auVar19 = vfmadd213ps_fma(auVar75,auVar68,ZEXT1632(auVar76));
        auVar47 = vrcp14ps_avx512vl(auVar72);
        auVar89 = ZEXT3264(auVar47);
        auVar50 = vxorps_avx512vl(auVar72,auVar65);
        in_ZMM8 = ZEXT3264(auVar50);
        auVar71 = auVar103._0_32_;
        auVar49 = vfnmadd213ps_avx512vl(auVar47,auVar72,auVar71);
        auVar76 = vfmadd132ps_fma(auVar49,auVar47,auVar47);
        auVar47 = *(undefined1 (*) [32])(ray + 0x100);
        in_ZMM10 = ZEXT3264(auVar47);
        auVar49 = ZEXT1632(CONCAT412(auVar76._12_4_ * (auVar19._12_4_ + auVar19._12_4_),
                                     CONCAT48(auVar76._8_4_ * (auVar19._8_4_ + auVar19._8_4_),
                                              CONCAT44(auVar76._4_4_ *
                                                       (auVar19._4_4_ + auVar19._4_4_),
                                                       auVar76._0_4_ *
                                                       (auVar19._0_4_ + auVar19._0_4_)))));
        uVar13 = vcmpps_avx512vl(auVar49,auVar47,2);
        uVar14 = vcmpps_avx512vl(auVar49,*(undefined1 (*) [32])(ray + 0x60),0xd);
        uVar17 = vcmpps_avx512vl(auVar72,auVar50,4);
        bVar36 = bVar36 & (byte)uVar13 & (byte)uVar14 & (byte)uVar17;
        if (bVar36 != 0) {
          pGVar2 = (context->scene->geometries).items[*(uint *)(lVar38 + uVar42 * 4)].ptr;
          uVar1 = pGVar2->mask;
          auVar88._4_4_ = uVar1;
          auVar88._0_4_ = uVar1;
          auVar88._8_4_ = uVar1;
          auVar88._12_4_ = uVar1;
          auVar88._16_4_ = uVar1;
          auVar88._20_4_ = uVar1;
          auVar88._24_4_ = uVar1;
          auVar88._28_4_ = uVar1;
          auVar89 = ZEXT3264(auVar88);
          uVar13 = vptestmd_avx512vl(auVar88,*(undefined1 (*) [32])(ray + 0x120));
          bVar36 = bVar36 & (byte)uVar13;
          if (bVar36 != 0) {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar2->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
              lVar38 = local_2ac0._0_8_;
            }
            else {
              auVar21._8_4_ = 0x219392ef;
              auVar21._0_8_ = 0x219392ef219392ef;
              auVar21._12_4_ = 0x219392ef;
              auVar21._16_4_ = 0x219392ef;
              auVar21._20_4_ = 0x219392ef;
              auVar21._24_4_ = 0x219392ef;
              auVar21._28_4_ = 0x219392ef;
              uVar37 = vcmpps_avx512vl(auVar48,auVar21,5);
              auVar72 = vrcp14ps_avx512vl(auVar48);
              auVar48 = vfnmadd213ps_avx512vl(auVar48,auVar72,auVar71);
              auVar48 = vfmadd132ps_avx512vl(auVar48,auVar72,auVar72);
              fVar96 = (float)((uint)((byte)uVar37 & 1) * auVar48._0_4_);
              fVar95 = (float)((uint)((byte)(uVar37 >> 1) & 1) * auVar48._4_4_);
              fVar94 = (float)((uint)((byte)(uVar37 >> 2) & 1) * auVar48._8_4_);
              fVar92 = (float)((uint)((byte)(uVar37 >> 3) & 1) * auVar48._12_4_);
              fVar97 = (float)((uint)((byte)(uVar37 >> 4) & 1) * auVar48._16_4_);
              fVar98 = (float)((uint)((byte)(uVar37 >> 5) & 1) * auVar48._20_4_);
              fVar99 = (float)((uint)((byte)(uVar37 >> 6) & 1) * auVar48._24_4_);
              auVar26._4_4_ = fVar95 * auVar59._4_4_;
              auVar26._0_4_ = fVar96 * auVar59._0_4_;
              auVar26._8_4_ = fVar94 * auVar59._8_4_;
              auVar26._12_4_ = fVar92 * auVar59._12_4_;
              auVar26._16_4_ = fVar97 * auVar59._16_4_;
              auVar26._20_4_ = fVar98 * auVar59._20_4_;
              auVar26._24_4_ = fVar99 * auVar59._24_4_;
              auVar26._28_4_ = auVar59._28_4_;
              auVar48 = vminps_avx512vl(auVar26,auVar71);
              auVar27._4_4_ = fVar95 * auVar60._4_4_;
              auVar27._0_4_ = fVar96 * auVar60._0_4_;
              auVar27._8_4_ = fVar94 * auVar60._8_4_;
              auVar27._12_4_ = fVar92 * auVar60._12_4_;
              auVar27._16_4_ = fVar97 * auVar60._16_4_;
              auVar27._20_4_ = fVar98 * auVar60._20_4_;
              auVar27._24_4_ = fVar99 * auVar60._24_4_;
              auVar27._28_4_ = auVar60._28_4_;
              auVar72 = vminps_avx512vl(auVar27,auVar71);
              local_29a0 = vsubps_avx512vl(auVar71,auVar48);
              local_2980 = vsubps_avx512vl(auVar71,auVar72);
              pRVar3 = context->user;
              local_2940 = vpbroadcastd_avx512vl();
              auVar89 = ZEXT3264(local_2940);
              local_2960 = vpbroadcastd_avx512vl();
              local_2a00[0] = (RTCHitN)(char)auVar68._0_4_;
              local_2a00[1] = (RTCHitN)(char)(auVar68._0_4_ >> 8);
              local_2a00[2] = (RTCHitN)(char)(auVar68._0_4_ >> 0x10);
              local_2a00[3] = (RTCHitN)(char)(auVar68._0_4_ >> 0x18);
              local_2a00[4] = (RTCHitN)(char)auVar68._4_4_;
              local_2a00[5] = (RTCHitN)(char)(auVar68._4_4_ >> 8);
              local_2a00[6] = (RTCHitN)(char)(auVar68._4_4_ >> 0x10);
              local_2a00[7] = (RTCHitN)(char)(auVar68._4_4_ >> 0x18);
              local_2a00[8] = (RTCHitN)(char)auVar68._8_4_;
              local_2a00[9] = (RTCHitN)(char)(auVar68._8_4_ >> 8);
              local_2a00[10] = (RTCHitN)(char)(auVar68._8_4_ >> 0x10);
              local_2a00[0xb] = (RTCHitN)(char)(auVar68._8_4_ >> 0x18);
              local_2a00[0xc] = (RTCHitN)(char)auVar68._12_4_;
              local_2a00[0xd] = (RTCHitN)(char)(auVar68._12_4_ >> 8);
              local_2a00[0xe] = (RTCHitN)(char)(auVar68._12_4_ >> 0x10);
              local_2a00[0xf] = (RTCHitN)(char)(auVar68._12_4_ >> 0x18);
              local_2a00[0x10] = (RTCHitN)(char)auVar68._16_4_;
              local_2a00[0x11] = (RTCHitN)(char)(auVar68._16_4_ >> 8);
              local_2a00[0x12] = (RTCHitN)(char)(auVar68._16_4_ >> 0x10);
              local_2a00[0x13] = (RTCHitN)(char)(auVar68._16_4_ >> 0x18);
              local_2a00[0x14] = (RTCHitN)(char)auVar68._20_4_;
              local_2a00[0x15] = (RTCHitN)(char)(auVar68._20_4_ >> 8);
              local_2a00[0x16] = (RTCHitN)(char)(auVar68._20_4_ >> 0x10);
              local_2a00[0x17] = (RTCHitN)(char)(auVar68._20_4_ >> 0x18);
              local_2a00[0x18] = (RTCHitN)(char)auVar68._24_4_;
              local_2a00[0x19] = (RTCHitN)(char)(auVar68._24_4_ >> 8);
              local_2a00[0x1a] = (RTCHitN)(char)(auVar68._24_4_ >> 0x10);
              local_2a00[0x1b] = (RTCHitN)(char)(auVar68._24_4_ >> 0x18);
              local_2a00[0x1c] = (RTCHitN)(char)auVar68._28_4_;
              local_2a00[0x1d] = (RTCHitN)(char)(auVar68._28_4_ >> 8);
              local_2a00[0x1e] = (RTCHitN)(char)(auVar68._28_4_ >> 0x10);
              local_2a00[0x1f] = (RTCHitN)(char)(auVar68._28_4_ >> 0x18);
              local_29e0 = auVar69;
              local_29c0 = auVar70;
              auVar48 = vpcmpeqd_avx2(auVar69,auVar69);
              local_2af8[1] = auVar48;
              *local_2af8 = auVar48;
              local_2920 = pRVar3->instID[0];
              uStack_291c = local_2920;
              uStack_2918 = local_2920;
              uStack_2914 = local_2920;
              uStack_2910 = local_2920;
              uStack_290c = local_2920;
              uStack_2908 = local_2920;
              uStack_2904 = local_2920;
              local_2900 = pRVar3->instPrimID[0];
              uStack_28fc = local_2900;
              uStack_28f8 = local_2900;
              uStack_28f4 = local_2900;
              uStack_28f0 = local_2900;
              uStack_28ec = local_2900;
              uStack_28e8 = local_2900;
              uStack_28e4 = local_2900;
              auVar48 = vblendmps_avx512vl(auVar47,auVar49);
              bVar45 = (bool)(bVar36 >> 1 & 1);
              bVar5 = (bool)(bVar36 >> 2 & 1);
              bVar6 = (bool)(bVar36 >> 3 & 1);
              bVar7 = (bool)(bVar36 >> 4 & 1);
              bVar8 = (bool)(bVar36 >> 5 & 1);
              bVar9 = (bool)(bVar36 >> 6 & 1);
              *(uint *)(ray + 0x100) =
                   (uint)(bVar36 & 1) * auVar48._0_4_ | !(bool)(bVar36 & 1) * local_2900;
              *(uint *)(ray + 0x104) = (uint)bVar45 * auVar48._4_4_ | !bVar45 * local_2900;
              *(uint *)(ray + 0x108) = (uint)bVar5 * auVar48._8_4_ | !bVar5 * local_2900;
              *(uint *)(ray + 0x10c) = (uint)bVar6 * auVar48._12_4_ | !bVar6 * local_2900;
              *(uint *)(ray + 0x110) = (uint)bVar7 * auVar48._16_4_ | !bVar7 * local_2900;
              *(uint *)(ray + 0x114) = (uint)bVar8 * auVar48._20_4_ | !bVar8 * local_2900;
              *(uint *)(ray + 0x118) = (uint)bVar9 * auVar48._24_4_ | !bVar9 * local_2900;
              *(uint *)(ray + 0x11c) =
                   (uint)(bVar36 >> 7) * auVar48._28_4_ | !(bool)(bVar36 >> 7) * local_2900;
              local_2aa0 = vpmovm2d_avx512vl((ulong)bVar36);
              local_2af0.valid = (int *)local_2aa0;
              local_2af0.geometryUserPtr = pGVar2->userPtr;
              local_2af0.context = context->user;
              local_2af0.hit = local_2a00;
              local_2af0.N = 8;
              local_2a40 = auVar47;
              local_2af0.ray = (RTCRayN *)ray;
              if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                auVar89 = ZEXT1664(local_2940._0_16_);
                in_ZMM8 = ZEXT1664(auVar50._0_16_);
                (*pGVar2->occlusionFilterN)(&local_2af0);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar101 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                auVar107 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar106 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar105 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar104 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar103 = ZEXT3264(auVar47);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar102 = ZEXT3264(auVar47);
                ray = local_2b20;
                uVar46 = local_2b18;
                context = local_2b10;
              }
              if (local_2aa0 == (undefined1  [32])0x0) {
                uVar37 = 0;
                lVar38 = local_2ac0._0_8_;
              }
              else {
                p_Var4 = context->args->filter;
                if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar2->field_8).field_0x2 & 0x40) != 0))))
                {
                  auVar89 = ZEXT1664(auVar89._0_16_);
                  in_ZMM8 = ZEXT1664(in_ZMM8._0_16_);
                  (*p_Var4)(&local_2af0);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar101 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x34000000));
                  auVar107 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                  auVar106 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                  auVar105 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                  auVar104 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar103 = ZEXT3264(auVar47);
                  auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar102 = ZEXT3264(auVar47);
                  ray = local_2b20;
                  uVar46 = local_2b18;
                  context = local_2b10;
                }
                uVar37 = vptestmd_avx512vl(local_2aa0,local_2aa0);
                auVar47 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar45 = (bool)((byte)uVar37 & 1);
                auVar73._0_4_ =
                     (uint)bVar45 * auVar47._0_4_ | (uint)!bVar45 * *(int *)(local_2af0.ray + 0x100)
                ;
                bVar45 = (bool)((byte)(uVar37 >> 1) & 1);
                auVar73._4_4_ =
                     (uint)bVar45 * auVar47._4_4_ | (uint)!bVar45 * *(int *)(local_2af0.ray + 0x104)
                ;
                bVar45 = (bool)((byte)(uVar37 >> 2) & 1);
                auVar73._8_4_ =
                     (uint)bVar45 * auVar47._8_4_ | (uint)!bVar45 * *(int *)(local_2af0.ray + 0x108)
                ;
                bVar45 = (bool)((byte)(uVar37 >> 3) & 1);
                auVar73._12_4_ =
                     (uint)bVar45 * auVar47._12_4_ |
                     (uint)!bVar45 * *(int *)(local_2af0.ray + 0x10c);
                bVar45 = (bool)((byte)(uVar37 >> 4) & 1);
                auVar73._16_4_ =
                     (uint)bVar45 * auVar47._16_4_ |
                     (uint)!bVar45 * *(int *)(local_2af0.ray + 0x110);
                bVar45 = (bool)((byte)(uVar37 >> 5) & 1);
                auVar73._20_4_ =
                     (uint)bVar45 * auVar47._20_4_ |
                     (uint)!bVar45 * *(int *)(local_2af0.ray + 0x114);
                bVar45 = (bool)((byte)(uVar37 >> 6) & 1);
                auVar73._24_4_ =
                     (uint)bVar45 * auVar47._24_4_ |
                     (uint)!bVar45 * *(int *)(local_2af0.ray + 0x118);
                bVar45 = SUB81(uVar37 >> 7,0);
                auVar73._28_4_ =
                     (uint)bVar45 * auVar47._28_4_ |
                     (uint)!bVar45 * *(int *)(local_2af0.ray + 0x11c);
                *(undefined1 (*) [32])(local_2af0.ray + 0x100) = auVar73;
                lVar38 = local_2ac0._0_8_;
              }
              bVar36 = (byte)uVar37;
              auVar74._0_4_ =
                   (uint)(bVar36 & 1) * *(int *)local_2b08 |
                   (uint)!(bool)(bVar36 & 1) * local_2a40._0_4_;
              bVar45 = (bool)((byte)(uVar37 >> 1) & 1);
              auVar74._4_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 4) | (uint)!bVar45 * local_2a40._4_4_;
              bVar45 = (bool)((byte)(uVar37 >> 2) & 1);
              auVar74._8_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 8) | (uint)!bVar45 * local_2a40._8_4_;
              bVar45 = (bool)((byte)(uVar37 >> 3) & 1);
              auVar74._12_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 0xc) | (uint)!bVar45 * local_2a40._12_4_;
              bVar45 = (bool)((byte)(uVar37 >> 4) & 1);
              auVar74._16_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 0x10) | (uint)!bVar45 * local_2a40._16_4_;
              bVar45 = (bool)((byte)(uVar37 >> 5) & 1);
              auVar74._20_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 0x14) | (uint)!bVar45 * local_2a40._20_4_;
              bVar45 = (bool)((byte)(uVar37 >> 6) & 1);
              auVar74._24_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 0x18) | (uint)!bVar45 * local_2a40._24_4_;
              bVar45 = (bool)((byte)(uVar37 >> 7) & 1);
              auVar74._28_4_ =
                   (uint)bVar45 * *(int *)(local_2b08 + 0x1c) | (uint)!bVar45 * local_2a40._28_4_;
              in_ZMM10 = ZEXT3264(auVar74);
              *(undefined1 (*) [32])local_2b08 = auVar74;
            }
            bVar43 = bVar43 & ~bVar36;
          }
        }
      }
      if ((bVar43 == 0) || (bVar45 = 2 < uVar42, uVar42 = uVar42 + 1, bVar45)) break;
    }
    bVar34 = bVar34 & bVar43;
    if (bVar34 == 0) break;
  }
  bVar34 = ~bVar34;
LAB_0070757e:
  bVar40 = bVar40 | bVar34;
  if (bVar40 == 0xff) {
    bVar40 = 0xff;
    goto LAB_007076bf;
  }
  auVar47 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  bVar45 = (bool)(bVar40 >> 1 & 1);
  bVar5 = (bool)(bVar40 >> 2 & 1);
  bVar6 = (bool)(bVar40 >> 3 & 1);
  bVar7 = (bool)(bVar40 >> 4 & 1);
  bVar8 = (bool)(bVar40 >> 5 & 1);
  bVar9 = (bool)(bVar40 >> 6 & 1);
  local_2740._4_4_ = (uint)bVar45 * auVar47._4_4_ | (uint)!bVar45 * local_2740._4_4_;
  local_2740._0_4_ =
       (uint)(bVar40 & 1) * auVar47._0_4_ | (uint)!(bool)(bVar40 & 1) * local_2740._0_4_;
  local_2740._8_4_ = (uint)bVar5 * auVar47._8_4_ | (uint)!bVar5 * local_2740._8_4_;
  local_2740._12_4_ = (uint)bVar6 * auVar47._12_4_ | (uint)!bVar6 * local_2740._12_4_;
  local_2740._16_4_ = (uint)bVar7 * auVar47._16_4_ | (uint)!bVar7 * local_2740._16_4_;
  local_2740._20_4_ = (uint)bVar8 * auVar47._20_4_ | (uint)!bVar8 * local_2740._20_4_;
  local_2740._24_4_ = (uint)bVar9 * auVar47._24_4_ | (uint)!bVar9 * local_2740._24_4_;
  local_2740._28_4_ =
       (uint)(bVar40 >> 7) * auVar47._28_4_ | (uint)!(bool)(bVar40 >> 7) * local_2740._28_4_;
  goto LAB_00706640;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }